

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx::SubGridIntersectorKMoeller<8,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ushort uVar5;
  ushort uVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  RTCRayQueryContext *pRVar10;
  size_t k;
  undefined1 auVar11 [32];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  __m256 afVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  int iVar96;
  uint uVar97;
  uint uVar98;
  uint uVar99;
  long lVar100;
  ulong uVar101;
  long lVar102;
  float *pfVar103;
  long lVar104;
  ulong uVar105;
  long lVar106;
  long lVar107;
  NodeRef root;
  ulong uVar108;
  undefined1 (*pauVar109) [32];
  uint i_1;
  undefined4 uVar110;
  ulong unaff_R14;
  ulong uVar111;
  ulong *puVar112;
  bool bVar113;
  undefined1 auVar115 [16];
  undefined1 auVar123 [16];
  float fVar114;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar124 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar146;
  float fVar149;
  float fVar151;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar144;
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar150;
  undefined1 in_ZMM0 [64];
  undefined1 auVar152 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar153 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar171;
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  undefined1 auVar172 [36];
  undefined1 auVar175 [32];
  undefined1 auVar173 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar174 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar194;
  undefined1 auVar182 [32];
  uint uVar191;
  uint uVar193;
  uint uVar195;
  uint uVar197;
  uint uVar199;
  uint uVar201;
  uint uVar202;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar190;
  float fVar192;
  float fVar196;
  float fVar198;
  float fVar200;
  undefined1 auVar189 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar230 [12];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar229;
  float fVar231;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar250;
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  float fVar255;
  float fVar257;
  float fVar258;
  undefined1 auVar256 [12];
  undefined1 auVar253 [16];
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar264;
  float fVar265;
  undefined1 auVar263 [32];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  Precalculations pre;
  vfloat<8> upper_y;
  vfloat<8> lower_z;
  vbool<8> terminated;
  vfloat<8> upper_z;
  vfloat<8> lower_x;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> lower_y;
  TravRayK<8,_false> tray;
  vfloat<8> upper_x;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_61f1;
  long local_61f0;
  long local_61e8;
  undefined1 local_61e0 [32];
  undefined1 local_61c0 [32];
  undefined1 local_61a0 [8];
  undefined8 uStack_6198;
  undefined8 uStack_6190;
  undefined8 uStack_6188;
  RTCHitN *local_6180;
  uint local_6178;
  undefined1 local_6160 [32];
  undefined1 local_6140 [4];
  undefined1 auStack_613c [4];
  undefined8 uStack_6138;
  undefined8 uStack_6130;
  undefined8 uStack_6128;
  undefined1 local_6120 [8];
  float fStack_6118;
  float fStack_6114;
  float fStack_6110;
  float fStack_610c;
  float fStack_6108;
  undefined1 local_6100 [32];
  undefined1 local_60e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_60c0;
  undefined1 local_60a0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_6080;
  undefined1 local_6060 [8];
  float fStack_6058;
  float fStack_6054;
  undefined1 auStack_6050 [8];
  float fStack_6048;
  float fStack_6044;
  RayK<8> *local_6038;
  undefined1 (*local_6030) [32];
  ulong local_6028;
  undefined8 local_6020;
  undefined8 uStack_6018;
  undefined8 uStack_6010;
  undefined8 uStack_6008;
  undefined1 local_6000 [32];
  undefined1 local_5fe0 [32];
  undefined8 local_5fc0;
  undefined8 uStack_5fb8;
  undefined8 uStack_5fb0;
  undefined8 uStack_5fa8;
  undefined8 local_5fa0;
  undefined8 uStack_5f98;
  undefined8 uStack_5f90;
  undefined8 uStack_5f88;
  undefined1 local_5f80 [20];
  uint uStack_5f6c;
  uint uStack_5f68;
  uint uStack_5f64;
  BVH *local_5f50;
  Intersectors *local_5f48;
  long local_5f40;
  long local_5f38;
  long local_5f30;
  ulong local_5f28;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5f20;
  undefined8 local_5f00;
  undefined8 uStack_5ef8;
  undefined8 local_5ef0;
  undefined8 uStack_5ee8;
  undefined1 local_5ee0 [32];
  undefined8 local_5ec0;
  undefined8 uStack_5eb8;
  undefined8 uStack_5eb0;
  undefined8 uStack_5ea8;
  undefined1 local_5ea0 [8];
  undefined8 uStack_5e98;
  undefined8 uStack_5e90;
  undefined8 uStack_5e88;
  undefined1 local_5e80 [32];
  undefined8 local_5e60;
  undefined8 uStack_5e58;
  undefined8 uStack_5e50;
  undefined8 uStack_5e48;
  float local_5e40;
  float fStack_5e3c;
  float fStack_5e38;
  float fStack_5e34;
  float fStack_5e30;
  float fStack_5e2c;
  float fStack_5e28;
  float fStack_5e24;
  float local_5e20;
  float fStack_5e1c;
  float fStack_5e18;
  float fStack_5e14;
  float fStack_5e10;
  float fStack_5e0c;
  float fStack_5e08;
  float fStack_5e04;
  float local_5e00;
  float fStack_5dfc;
  float fStack_5df8;
  float fStack_5df4;
  float fStack_5df0;
  float fStack_5dec;
  float fStack_5de8;
  undefined4 uStack_5de4;
  undefined1 local_5de0 [16];
  undefined1 local_5dd0 [16];
  uint local_5dc0;
  uint uStack_5dbc;
  uint uStack_5db8;
  uint uStack_5db4;
  uint uStack_5db0;
  uint uStack_5dac;
  uint uStack_5da8;
  uint uStack_5da4;
  uint local_5da0;
  uint uStack_5d9c;
  uint uStack_5d98;
  uint uStack_5d94;
  uint uStack_5d90;
  uint uStack_5d8c;
  uint uStack_5d88;
  uint uStack_5d84;
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [8];
  float fStack_5d18;
  float fStack_5d14;
  float fStack_5d10;
  float fStack_5d0c;
  float fStack_5d08;
  float fStack_5d04;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5d00;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5ce0;
  undefined1 local_5cc0 [16];
  undefined1 local_5cb0 [16];
  undefined1 local_5ca0 [16];
  undefined1 local_5c90 [16];
  float local_5c80 [4];
  float fStack_5c70;
  float fStack_5c6c;
  float fStack_5c68;
  float fStack_5c64;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c20;
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [8];
  float fStack_5b58;
  float fStack_5b54;
  float fStack_5b50;
  float fStack_5b4c;
  float fStack_5b48;
  undefined1 local_5b40 [8];
  float fStack_5b38;
  float fStack_5b34;
  float fStack_5b30;
  float fStack_5b2c;
  float fStack_5b28;
  undefined1 local_5b20 [8];
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined8 local_5a60;
  undefined8 uStack_5a58;
  undefined8 uStack_5a50;
  undefined8 uStack_5a48;
  undefined8 local_5a40;
  undefined8 uStack_5a38;
  undefined1 local_5a30 [16];
  undefined8 local_5a20;
  undefined8 uStack_5a18;
  undefined8 local_5a10;
  undefined8 uStack_5a08;
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined8 local_59f0;
  undefined8 uStack_59e8;
  undefined1 local_59e0 [16];
  undefined8 local_59d0;
  undefined8 uStack_59c8;
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 local_59b0;
  undefined8 uStack_59a8;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 local_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 local_5970;
  undefined8 uStack_5968;
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  float fStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  float fStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  float fStack_58c4;
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  float fStack_58a4;
  float local_58a0;
  float fStack_589c;
  float fStack_5898;
  float fStack_5894;
  float fStack_5890;
  float fStack_588c;
  float fStack_5888;
  float fStack_5884;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  float fStack_5864;
  float local_5860;
  float fStack_585c;
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  float fStack_5844;
  float local_5840;
  float fStack_583c;
  float fStack_5838;
  float fStack_5834;
  float fStack_5830;
  float fStack_582c;
  float fStack_5828;
  float fStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined4 local_4680;
  undefined4 uStack_467c;
  undefined4 uStack_4678;
  undefined4 uStack_4674;
  undefined4 uStack_4670;
  undefined4 uStack_466c;
  undefined4 uStack_4668;
  undefined4 uStack_4664;
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar222 [64];
  undefined1 auVar254 [32];
  
  local_5808 = (((BVH *)This->ptr)->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar124 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      auVar116 = vpcmpeqd_avx(auVar124,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
      auVar124 = vpcmpeqd_avx(auVar124,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
      auVar117 = ZEXT816(0) << 0x40;
      auVar140 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar117),5);
      auVar211._16_16_ = auVar124;
      auVar211._0_16_ = auVar116;
      auVar158 = auVar211 & auVar140;
      if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar158 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar158 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar158 >> 0x7f,0) != '\0') ||
            (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar158 >> 0xbf,0) != '\0') ||
          (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar158[0x1f] < '\0') {
        local_5960 = vandps_avx(auVar140,auVar211);
        local_5c20._0_8_ = *(undefined8 *)ray;
        local_5c20._8_8_ = *(undefined8 *)(ray + 8);
        local_5c20._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5c20._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5c20._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5c20._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5c20._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5c20._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5c20._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5c20._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5c20._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5c20._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5bc0 = *(undefined1 (*) [32])(ray + 0x80);
        local_5ba0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5b80 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar246._8_4_ = 0x7fffffff;
        auVar246._0_8_ = 0x7fffffff7fffffff;
        auVar246._12_4_ = 0x7fffffff;
        auVar246._16_4_ = 0x7fffffff;
        auVar246._20_4_ = 0x7fffffff;
        auVar246._24_4_ = 0x7fffffff;
        auVar246._28_4_ = 0x7fffffff;
        auVar226._8_4_ = 0x219392ef;
        auVar226._0_8_ = 0x219392ef219392ef;
        auVar226._12_4_ = 0x219392ef;
        auVar226._16_4_ = 0x219392ef;
        auVar226._20_4_ = 0x219392ef;
        auVar226._24_4_ = 0x219392ef;
        auVar226._28_4_ = 0x219392ef;
        auVar140 = vandps_avx(auVar246,local_5bc0);
        auVar140 = vcmpps_avx(auVar140,auVar226,1);
        auVar158 = vblendvps_avx(local_5bc0,auVar226,auVar140);
        auVar140 = vandps_avx(auVar246,local_5ba0);
        auVar140 = vcmpps_avx(auVar140,auVar226,1);
        auVar211 = vblendvps_avx(local_5ba0,auVar226,auVar140);
        auVar140 = vandps_avx(auVar246,local_5b80);
        auVar140 = vcmpps_avx(auVar140,auVar226,1);
        auVar140 = vblendvps_avx(local_5b80,auVar226,auVar140);
        auVar36 = vrcpps_avx(auVar158);
        fVar145 = auVar36._0_4_;
        fVar146 = auVar36._4_4_;
        auVar37._4_4_ = auVar158._4_4_ * fVar146;
        auVar37._0_4_ = auVar158._0_4_ * fVar145;
        fVar147 = auVar36._8_4_;
        auVar37._8_4_ = auVar158._8_4_ * fVar147;
        fVar149 = auVar36._12_4_;
        auVar37._12_4_ = auVar158._12_4_ * fVar149;
        fVar151 = auVar36._16_4_;
        auVar37._16_4_ = auVar158._16_4_ * fVar151;
        fVar148 = auVar36._20_4_;
        auVar37._20_4_ = auVar158._20_4_ * fVar148;
        fVar150 = auVar36._24_4_;
        auVar37._24_4_ = auVar158._24_4_ * fVar150;
        auVar37._28_4_ = auVar158._28_4_;
        auVar232._8_4_ = 0x3f800000;
        auVar232._0_8_ = 0x3f8000003f800000;
        auVar232._12_4_ = 0x3f800000;
        auVar232._16_4_ = 0x3f800000;
        auVar232._20_4_ = 0x3f800000;
        auVar232._24_4_ = 0x3f800000;
        auVar232._28_4_ = 0x3f800000;
        auVar158 = vsubps_avx(auVar232,auVar37);
        local_5b60._0_4_ = fVar145 + fVar145 * auVar158._0_4_;
        local_5b60._4_4_ = fVar146 + fVar146 * auVar158._4_4_;
        fStack_5b58 = fVar147 + fVar147 * auVar158._8_4_;
        fStack_5b54 = fVar149 + fVar149 * auVar158._12_4_;
        fStack_5b50 = fVar151 + fVar151 * auVar158._16_4_;
        fStack_5b4c = fVar148 + fVar148 * auVar158._20_4_;
        fStack_5b48 = fVar150 + fVar150 * auVar158._24_4_;
        register0x0000129c = auVar36._28_4_ + auVar158._28_4_;
        auVar158 = vrcpps_avx(auVar211);
        fVar145 = auVar158._0_4_;
        fVar146 = auVar158._4_4_;
        auVar36._4_4_ = auVar211._4_4_ * fVar146;
        auVar36._0_4_ = auVar211._0_4_ * fVar145;
        fVar147 = auVar158._8_4_;
        auVar36._8_4_ = auVar211._8_4_ * fVar147;
        fVar149 = auVar158._12_4_;
        auVar36._12_4_ = auVar211._12_4_ * fVar149;
        fVar151 = auVar158._16_4_;
        auVar36._16_4_ = auVar211._16_4_ * fVar151;
        fVar148 = auVar158._20_4_;
        auVar36._20_4_ = auVar211._20_4_ * fVar148;
        fVar150 = auVar158._24_4_;
        auVar36._24_4_ = auVar211._24_4_ * fVar150;
        auVar36._28_4_ = auVar211._28_4_;
        auVar211 = vsubps_avx(auVar232,auVar36);
        local_5b40._0_4_ = fVar145 + fVar145 * auVar211._0_4_;
        local_5b40._4_4_ = fVar146 + fVar146 * auVar211._4_4_;
        fStack_5b38 = fVar147 + fVar147 * auVar211._8_4_;
        fStack_5b34 = fVar149 + fVar149 * auVar211._12_4_;
        fStack_5b30 = fVar151 + fVar151 * auVar211._16_4_;
        fStack_5b2c = fVar148 + fVar148 * auVar211._20_4_;
        fStack_5b28 = fVar150 + fVar150 * auVar211._24_4_;
        register0x000012dc = auVar158._28_4_ + auVar211._28_4_;
        auVar158 = vrcpps_avx(auVar140);
        fVar145 = auVar158._0_4_;
        fVar146 = auVar158._4_4_;
        auVar38._4_4_ = auVar140._4_4_ * fVar146;
        auVar38._0_4_ = auVar140._0_4_ * fVar145;
        fVar147 = auVar158._8_4_;
        auVar38._8_4_ = auVar140._8_4_ * fVar147;
        fVar149 = auVar158._12_4_;
        auVar38._12_4_ = auVar140._12_4_ * fVar149;
        fVar151 = auVar158._16_4_;
        auVar38._16_4_ = auVar140._16_4_ * fVar151;
        fVar148 = auVar158._20_4_;
        auVar38._20_4_ = auVar140._20_4_ * fVar148;
        fVar150 = auVar158._24_4_;
        auVar38._24_4_ = auVar140._24_4_ * fVar150;
        auVar38._28_4_ = auVar140._28_4_;
        auVar140 = vsubps_avx(auVar232,auVar38);
        local_5b20._0_4_ = fVar145 + fVar145 * auVar140._0_4_;
        local_5b20._4_4_ = fVar146 + fVar146 * auVar140._4_4_;
        fStack_5b18 = fVar147 + fVar147 * auVar140._8_4_;
        fStack_5b14 = fVar149 + fVar149 * auVar140._12_4_;
        fStack_5b10 = fVar151 + fVar151 * auVar140._16_4_;
        fStack_5b0c = fVar148 + fVar148 * auVar140._20_4_;
        fStack_5b08 = fVar150 + fVar150 * auVar140._24_4_;
        register0x0000131c = auVar158._28_4_ + auVar140._28_4_;
        auVar158._8_4_ = 0x20;
        auVar158._0_8_ = 0x2000000020;
        auVar158._12_4_ = 0x20;
        auVar158._16_4_ = 0x20;
        auVar158._20_4_ = 0x20;
        auVar158._24_4_ = 0x20;
        auVar158._28_4_ = 0x20;
        auVar140 = vcmpps_avx(_local_5b60,ZEXT1632(auVar117),1);
        local_5b00 = vandps_avx(auVar140,auVar158);
        auVar158 = ZEXT1632(auVar117);
        auVar140 = vcmpps_avx(_local_5b40,auVar158,5);
        auVar212._8_4_ = 0x40;
        auVar212._0_8_ = 0x4000000040;
        auVar212._12_4_ = 0x40;
        auVar212._16_4_ = 0x40;
        auVar212._20_4_ = 0x40;
        auVar212._24_4_ = 0x40;
        auVar212._28_4_ = 0x40;
        auVar227._8_4_ = 0x60;
        auVar227._0_8_ = 0x6000000060;
        auVar227._12_4_ = 0x60;
        auVar227._16_4_ = 0x60;
        auVar227._20_4_ = 0x60;
        auVar227._24_4_ = 0x60;
        auVar227._28_4_ = 0x60;
        local_5ae0 = vblendvps_avx(auVar227,auVar212,auVar140);
        auVar140 = vcmpps_avx(_local_5b20,auVar158,5);
        auVar213._8_4_ = 0x80;
        auVar213._0_8_ = 0x8000000080;
        auVar213._12_4_ = 0x80;
        auVar213._16_4_ = 0x80;
        auVar213._20_4_ = 0x80;
        auVar213._24_4_ = 0x80;
        auVar213._28_4_ = 0x80;
        auVar220._8_4_ = 0xa0;
        auVar220._0_8_ = 0xa0000000a0;
        auVar220._12_4_ = 0xa0;
        auVar220._16_4_ = 0xa0;
        auVar220._20_4_ = 0xa0;
        auVar220._24_4_ = 0xa0;
        auVar220._28_4_ = 0xa0;
        auVar222 = ZEXT3264(auVar220);
        local_5ac0 = vblendvps_avx(auVar220,auVar213,auVar140);
        auVar140 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar158);
        auVar158 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar158);
        auVar125._8_4_ = 0x7f800000;
        auVar125._0_8_ = 0x7f8000007f800000;
        auVar125._12_4_ = 0x7f800000;
        auVar125._16_4_ = 0x7f800000;
        auVar125._20_4_ = 0x7f800000;
        auVar125._24_4_ = 0x7f800000;
        auVar125._28_4_ = 0x7f800000;
        local_5aa0 = vblendvps_avx(auVar125,auVar140,local_5960);
        auVar140._8_4_ = 0xff800000;
        auVar140._0_8_ = 0xff800000ff800000;
        auVar140._12_4_ = 0xff800000;
        auVar140._16_4_ = 0xff800000;
        auVar140._20_4_ = 0xff800000;
        auVar140._24_4_ = 0xff800000;
        auVar140._28_4_ = 0xff800000;
        auVar189 = ZEXT3264(auVar140);
        local_5a80 = vblendvps_avx(auVar140,auVar158,local_5960);
        auVar140 = vcmpps_avx(local_5a80,local_5a80,0xf);
        local_5f80._4_4_ = local_5960._4_4_ ^ auVar140._4_4_;
        local_5f80._0_4_ = local_5960._0_4_ ^ auVar140._0_4_;
        local_5f80._8_4_ = local_5960._8_4_ ^ auVar140._8_4_;
        local_5f80._12_4_ = local_5960._12_4_ ^ auVar140._12_4_;
        local_5f80._16_4_ = local_5960._16_4_ ^ auVar140._16_4_;
        uStack_5f6c = local_5960._20_4_ ^ auVar140._20_4_;
        uStack_5f68 = local_5960._24_4_ ^ auVar140._24_4_;
        uStack_5f64 = local_5960._28_4_ ^ auVar140._28_4_;
        local_5f48 = This;
        local_5f50 = (BVH *)This->ptr;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar105 = 7;
        }
        else {
          uVar105 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_6038 = ray + 0x100;
        puVar112 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar109 = (undefined1 (*) [32])local_4640;
        local_4680 = 0x7f800000;
        uStack_467c = 0x7f800000;
        uStack_4678 = 0x7f800000;
        uStack_4674 = 0x7f800000;
        uStack_4670 = 0x7f800000;
        uStack_466c = 0x7f800000;
        uStack_4668 = 0x7f800000;
        uStack_4664 = 0x7f800000;
        local_4660 = local_5aa0;
        local_6020 = mm_lookupmask_ps._16_8_;
        uStack_6018 = mm_lookupmask_ps._24_8_;
        uStack_6010 = mm_lookupmask_ps._16_8_;
        uStack_6008 = mm_lookupmask_ps._24_8_;
        local_6030 = (undefined1 (*) [32])&local_5dc0;
        local_6028 = uVar105;
LAB_0103bac9:
        do {
          do {
            root.ptr = puVar112[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_0103d925;
            puVar112 = puVar112 + -1;
            pauVar109 = pauVar109 + -1;
            local_61e0 = *pauVar109;
            auVar170 = ZEXT3264(local_61e0);
            auVar140 = vcmpps_avx(local_61e0,local_5a80,1);
          } while ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar140 >> 0x7f,0) == '\0') &&
                     (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar140 >> 0xbf,0) == '\0') &&
                   (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar140[0x1f]);
          uVar110 = vmovmskps_avx(auVar140);
          unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar110);
          if (uVar105 < (uint)POPCOUNT(uVar110)) {
LAB_0103bb08:
            do {
              uVar108 = 8;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_0103d925;
                auVar140 = vcmpps_avx(local_5a80,auVar170._0_32_,6);
                if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar140 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar140 >> 0x7f,0) != '\0') ||
                      (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar140 >> 0xbf,0) != '\0') ||
                    (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar140[0x1f] < '\0') {
                  local_5f40 = (ulong)((uint)root.ptr & 0xf) - 8;
                  uVar108 = root.ptr & 0xfffffffffffffff0;
                  auVar140 = vcmpps_avx(auVar140,auVar140,0xf);
                  auVar170 = ZEXT3264(auVar140);
                  auVar272 = ZEXT3264(CONCAT428(auVar140._28_4_ ^ uStack_5f64,
                                                CONCAT424(auVar140._24_4_ ^ uStack_5f68,
                                                          CONCAT420(auVar140._20_4_ ^ uStack_5f6c,
                                                                    CONCAT416(auVar140._16_4_ ^
                                                                              local_5f80._16_4_,
                                                                              CONCAT412(auVar140.
                                                  _12_4_ ^ local_5f80._12_4_,
                                                  CONCAT48(auVar140._8_4_ ^ local_5f80._8_4_,
                                                           CONCAT44(auVar140._4_4_ ^
                                                                    local_5f80._4_4_,
                                                                    auVar140._0_4_ ^
                                                                    local_5f80._0_4_))))))));
                  lVar100 = 0;
                  while (lVar100 != local_5f40) {
                    local_5f38 = lVar100;
                    lVar100 = lVar100 * 0x90;
                    auVar116._8_8_ = 0;
                    auVar116._0_8_ = *(ulong *)(uVar108 + 0x40 + lVar100);
                    auVar124._8_8_ = 0;
                    auVar124._0_8_ = *(ulong *)(uVar108 + 0x48 + lVar100);
                    auVar124 = vpminub_avx(auVar116,auVar124);
                    auVar124 = vpcmpeqb_avx(auVar116,auVar124);
                    auVar116 = vpcmpeqd_avx(auVar222._0_16_,auVar222._0_16_);
                    auVar222 = ZEXT1664(auVar116);
                    auVar117 = vpmovsxbd_avx(auVar124 ^ auVar116);
                    auVar153._8_8_ = 0;
                    auVar153._0_8_ = *(ulong *)(uVar108 + 0x44 + lVar100);
                    auVar204._8_8_ = 0;
                    auVar204._0_8_ = *(ulong *)(uVar108 + 0x4c + lVar100);
                    auVar124 = vpminub_avx(auVar153,auVar204);
                    auVar189 = ZEXT1664(auVar124);
                    auVar124 = vpcmpeqb_avx(auVar153,auVar124);
                    auVar124 = vpmovsxbd_avx(auVar124 ^ auVar116);
                    auVar128._16_16_ = auVar124;
                    auVar128._0_16_ = auVar117;
                    auVar140 = vcvtdq2ps_avx(auVar128);
                    auVar162._8_4_ = 0xbf800000;
                    auVar162._0_8_ = 0xbf800000bf800000;
                    auVar162._12_4_ = 0xbf800000;
                    auVar162._16_4_ = 0xbf800000;
                    auVar162._20_4_ = 0xbf800000;
                    auVar162._24_4_ = 0xbf800000;
                    auVar162._28_4_ = 0xbf800000;
                    auVar140 = vcmpps_avx(auVar162,auVar140,1);
                    auVar170 = ZEXT3264(auVar140);
                    uVar97 = vmovmskps_avx(auVar140);
                    if (uVar97 != 0) {
                      lVar100 = lVar100 + uVar108;
                      uVar101 = (ulong)(uVar97 & 0xff);
                      local_5f30 = lVar100;
                      do {
                        lVar104 = 0;
                        if (uVar101 != 0) {
                          for (; (uVar101 >> lVar104 & 1) == 0; lVar104 = lVar104 + 1) {
                          }
                        }
                        auVar117._8_8_ = 0;
                        auVar117._0_8_ = *(ulong *)(lVar100 + 0x40);
                        auVar124 = vpmovzxbd_avx(auVar117);
                        auVar154._8_8_ = 0;
                        auVar154._0_8_ = *(ulong *)(lVar100 + 0x44);
                        auVar116 = vpmovzxbd_avx(auVar154);
                        auVar129._16_16_ = auVar116;
                        auVar129._0_16_ = auVar124;
                        auVar140 = vcvtdq2ps_avx(auVar129);
                        fVar145 = *(float *)(lVar100 + 0x7c);
                        fVar146 = *(float *)(lVar100 + 0x70);
                        local_5ea0._4_4_ = fVar146 + fVar145 * auVar140._4_4_;
                        local_5ea0._0_4_ = fVar146 + fVar145 * auVar140._0_4_;
                        uStack_5e98._0_4_ = fVar146 + fVar145 * auVar140._8_4_;
                        uStack_5e98._4_4_ = fVar146 + fVar145 * auVar140._12_4_;
                        uStack_5e90._0_4_ = fVar146 + fVar145 * auVar140._16_4_;
                        uStack_5e90._4_4_ = fVar146 + fVar145 * auVar140._20_4_;
                        uStack_5e88._0_4_ = fVar146 + fVar145 * auVar140._24_4_;
                        uStack_5e88._4_4_ = fVar146 + auVar140._28_4_;
                        auVar118._8_8_ = 0;
                        auVar118._0_8_ = *(ulong *)(lVar100 + 0x48);
                        auVar124 = vpmovzxbd_avx(auVar118);
                        auVar205._8_8_ = 0;
                        auVar205._0_8_ = *(ulong *)(lVar100 + 0x4c);
                        auVar116 = vpmovzxbd_avx(auVar205);
                        auVar130._16_16_ = auVar116;
                        auVar130._0_16_ = auVar124;
                        auVar140 = vcvtdq2ps_avx(auVar130);
                        local_5a60 = CONCAT44(fVar146 + fVar145 * auVar140._4_4_,
                                              fVar146 + fVar145 * auVar140._0_4_);
                        uStack_5a58 = CONCAT44(fVar146 + fVar145 * auVar140._12_4_,
                                               fVar146 + fVar145 * auVar140._8_4_);
                        uStack_5a50 = CONCAT44(fVar146 + fVar145 * auVar140._20_4_,
                                               fVar146 + fVar145 * auVar140._16_4_);
                        uStack_5a48 = CONCAT44(fVar146 + auVar140._28_4_,
                                               fVar146 + fVar145 * auVar140._24_4_);
                        auVar119._8_8_ = 0;
                        auVar119._0_8_ = *(ulong *)(lVar100 + 0x50);
                        auVar124 = vpmovzxbd_avx(auVar119);
                        auVar155._8_8_ = 0;
                        auVar155._0_8_ = *(ulong *)(lVar100 + 0x54);
                        auVar116 = vpmovzxbd_avx(auVar155);
                        auVar131._16_16_ = auVar116;
                        auVar131._0_16_ = auVar124;
                        auVar140 = vcvtdq2ps_avx(auVar131);
                        fVar145 = *(float *)(lVar100 + 0x80);
                        fVar146 = *(float *)(lVar100 + 0x74);
                        local_5c80[0] = fVar146 + fVar145 * auVar140._0_4_;
                        local_5c80[1] = fVar146 + fVar145 * auVar140._4_4_;
                        local_5c80[2] = fVar146 + fVar145 * auVar140._8_4_;
                        local_5c80[3] = fVar146 + fVar145 * auVar140._12_4_;
                        fStack_5c70 = fVar146 + fVar145 * auVar140._16_4_;
                        fStack_5c6c = fVar146 + fVar145 * auVar140._20_4_;
                        fStack_5c68 = fVar146 + fVar145 * auVar140._24_4_;
                        fStack_5c64 = fVar146 + auVar140._28_4_;
                        auVar120._8_8_ = 0;
                        auVar120._0_8_ = *(ulong *)(lVar100 + 0x58);
                        auVar124 = vpmovzxbd_avx(auVar120);
                        auVar206._8_8_ = 0;
                        auVar206._0_8_ = *(ulong *)(lVar100 + 0x5c);
                        auVar116 = vpmovzxbd_avx(auVar206);
                        auVar132._16_16_ = auVar116;
                        auVar132._0_16_ = auVar124;
                        auVar140 = vcvtdq2ps_avx(auVar132);
                        local_61a0._4_4_ = fVar146 + fVar145 * auVar140._4_4_;
                        local_61a0._0_4_ = fVar146 + fVar145 * auVar140._0_4_;
                        uStack_6198._4_4_ = fVar146 + fVar145 * auVar140._12_4_;
                        uStack_6198._0_4_ = fVar146 + fVar145 * auVar140._8_4_;
                        uStack_6190._4_4_ = fVar146 + fVar145 * auVar140._20_4_;
                        uStack_6190._0_4_ = fVar146 + fVar145 * auVar140._16_4_;
                        uStack_6188._4_4_ = fVar146 + auVar140._28_4_;
                        uStack_6188._0_4_ = fVar146 + fVar145 * auVar140._24_4_;
                        auVar121._8_8_ = 0;
                        auVar121._0_8_ = *(ulong *)(lVar100 + 0x60);
                        auVar124 = vpmovzxbd_avx(auVar121);
                        auVar156._8_8_ = 0;
                        auVar156._0_8_ = *(ulong *)(lVar100 + 100);
                        auVar116 = vpmovzxbd_avx(auVar156);
                        auVar133._16_16_ = auVar116;
                        auVar133._0_16_ = auVar124;
                        auVar140 = vcvtdq2ps_avx(auVar133);
                        fVar145 = *(float *)(lVar100 + 0x84);
                        fVar146 = *(float *)(lVar100 + 0x78);
                        local_6060._4_4_ = fVar146 + fVar145 * auVar140._4_4_;
                        local_6060._0_4_ = fVar146 + fVar145 * auVar140._0_4_;
                        fStack_6058 = fVar146 + fVar145 * auVar140._8_4_;
                        fStack_6054 = fVar146 + fVar145 * auVar140._12_4_;
                        auStack_6050._0_4_ = fVar146 + fVar145 * auVar140._16_4_;
                        auStack_6050._4_4_ = fVar146 + fVar145 * auVar140._20_4_;
                        fStack_6048 = fVar146 + fVar145 * auVar140._24_4_;
                        fStack_6044 = fVar146 + auVar140._28_4_;
                        auVar122._8_8_ = 0;
                        auVar122._0_8_ = *(ulong *)(lVar100 + 0x68);
                        auVar124 = vpmovzxbd_avx(auVar122);
                        auVar207._8_8_ = 0;
                        auVar207._0_8_ = *(ulong *)(lVar100 + 0x6c);
                        auVar116 = vpmovzxbd_avx(auVar207);
                        auVar134._16_16_ = auVar116;
                        auVar134._0_16_ = auVar124;
                        auVar140 = vcvtdq2ps_avx(auVar134);
                        local_5f20.v[0] = fVar146 + fVar145 * auVar140._0_4_;
                        local_5f20.v[1] = fVar146 + fVar145 * auVar140._4_4_;
                        local_5f20.v[2] = fVar146 + fVar145 * auVar140._8_4_;
                        local_5f20.v[3] = fVar146 + fVar145 * auVar140._12_4_;
                        local_5f20.v[4] = fVar146 + fVar145 * auVar140._16_4_;
                        local_5f20.v[5] = fVar146 + fVar145 * auVar140._20_4_;
                        local_5f20.v[6] = fVar146 + fVar145 * auVar140._24_4_;
                        local_5f20.v[7] = fVar146 + auVar140._28_4_;
                        uVar110 = *(undefined4 *)(local_5ea0 + lVar104 * 4);
                        auVar135._4_4_ = uVar110;
                        auVar135._0_4_ = uVar110;
                        auVar135._8_4_ = uVar110;
                        auVar135._12_4_ = uVar110;
                        auVar135._16_4_ = uVar110;
                        auVar135._20_4_ = uVar110;
                        auVar135._24_4_ = uVar110;
                        auVar135._28_4_ = uVar110;
                        auVar83._8_8_ = local_5c20._8_8_;
                        auVar83._0_8_ = local_5c20._0_8_;
                        auVar83._16_8_ = local_5c20._16_8_;
                        auVar83._24_8_ = local_5c20._24_8_;
                        auVar85._8_8_ = local_5c20._40_8_;
                        auVar85._0_8_ = local_5c20._32_8_;
                        auVar85._16_8_ = local_5c20._48_8_;
                        auVar85._24_8_ = local_5c20._56_8_;
                        auVar87._8_8_ = local_5c20._72_8_;
                        auVar87._0_8_ = local_5c20._64_8_;
                        auVar87._16_8_ = local_5c20._80_8_;
                        auVar87._24_8_ = local_5c20._88_8_;
                        auVar140 = vsubps_avx(auVar135,auVar83);
                        auVar123._0_4_ = (float)local_5b60._0_4_ * auVar140._0_4_;
                        auVar123._4_4_ = (float)local_5b60._4_4_ * auVar140._4_4_;
                        auVar123._8_4_ = fStack_5b58 * auVar140._8_4_;
                        auVar123._12_4_ = fStack_5b54 * auVar140._12_4_;
                        auVar50._16_4_ = fStack_5b50 * auVar140._16_4_;
                        auVar50._0_16_ = auVar123;
                        auVar50._20_4_ = fStack_5b4c * auVar140._20_4_;
                        auVar50._24_4_ = fStack_5b48 * auVar140._24_4_;
                        auVar50._28_4_ = auVar140._28_4_;
                        fVar145 = local_5c80[lVar104];
                        auVar163._4_4_ = fVar145;
                        auVar163._0_4_ = fVar145;
                        auVar163._8_4_ = fVar145;
                        auVar163._12_4_ = fVar145;
                        auVar163._16_4_ = fVar145;
                        auVar163._20_4_ = fVar145;
                        auVar163._24_4_ = fVar145;
                        auVar163._28_4_ = fVar145;
                        auVar140 = vsubps_avx(auVar163,auVar85);
                        auVar157._0_4_ = (float)local_5b40._0_4_ * auVar140._0_4_;
                        auVar157._4_4_ = (float)local_5b40._4_4_ * auVar140._4_4_;
                        auVar157._8_4_ = fStack_5b38 * auVar140._8_4_;
                        auVar157._12_4_ = fStack_5b34 * auVar140._12_4_;
                        auVar51._16_4_ = fStack_5b30 * auVar140._16_4_;
                        auVar51._0_16_ = auVar157;
                        auVar51._20_4_ = fStack_5b2c * auVar140._20_4_;
                        auVar51._24_4_ = fStack_5b28 * auVar140._24_4_;
                        auVar51._28_4_ = auVar140._28_4_;
                        uVar110 = *(undefined4 *)(local_6060 + lVar104 * 4);
                        auVar178._4_4_ = uVar110;
                        auVar178._0_4_ = uVar110;
                        auVar178._8_4_ = uVar110;
                        auVar178._12_4_ = uVar110;
                        auVar178._16_4_ = uVar110;
                        auVar178._20_4_ = uVar110;
                        auVar178._24_4_ = uVar110;
                        auVar178._28_4_ = uVar110;
                        auVar140 = vsubps_avx(auVar178,auVar87);
                        auVar174._0_4_ = (float)local_5b20._0_4_ * auVar140._0_4_;
                        auVar174._4_4_ = (float)local_5b20._4_4_ * auVar140._4_4_;
                        auVar174._8_4_ = fStack_5b18 * auVar140._8_4_;
                        auVar174._12_4_ = fStack_5b14 * auVar140._12_4_;
                        auVar52._16_4_ = fStack_5b10 * auVar140._16_4_;
                        auVar52._0_16_ = auVar174;
                        auVar52._20_4_ = fStack_5b0c * auVar140._20_4_;
                        auVar52._24_4_ = fStack_5b08 * auVar140._24_4_;
                        auVar52._28_4_ = auVar140._28_4_;
                        uVar110 = *(undefined4 *)((long)&local_5a60 + lVar104 * 4);
                        auVar249._4_4_ = uVar110;
                        auVar249._0_4_ = uVar110;
                        auVar249._8_4_ = uVar110;
                        auVar249._12_4_ = uVar110;
                        auVar249._16_4_ = uVar110;
                        auVar249._20_4_ = uVar110;
                        auVar249._24_4_ = uVar110;
                        auVar249._28_4_ = uVar110;
                        auVar140 = vsubps_avx(auVar249,auVar83);
                        auVar208._0_4_ = (float)local_5b60._0_4_ * auVar140._0_4_;
                        auVar208._4_4_ = (float)local_5b60._4_4_ * auVar140._4_4_;
                        auVar208._8_4_ = fStack_5b58 * auVar140._8_4_;
                        auVar208._12_4_ = fStack_5b54 * auVar140._12_4_;
                        auVar53._16_4_ = fStack_5b50 * auVar140._16_4_;
                        auVar53._0_16_ = auVar208;
                        auVar53._20_4_ = fStack_5b4c * auVar140._20_4_;
                        auVar53._24_4_ = fStack_5b48 * auVar140._24_4_;
                        auVar53._28_4_ = auVar140._28_4_;
                        uVar110 = *(undefined4 *)(local_61a0 + lVar104 * 4);
                        auVar235._4_4_ = uVar110;
                        auVar235._0_4_ = uVar110;
                        auVar235._8_4_ = uVar110;
                        auVar235._12_4_ = uVar110;
                        auVar235._16_4_ = uVar110;
                        auVar235._20_4_ = uVar110;
                        auVar235._24_4_ = uVar110;
                        auVar235._28_4_ = uVar110;
                        auVar140 = vsubps_avx(auVar235,auVar85);
                        auVar218._0_4_ = (float)local_5b40._0_4_ * auVar140._0_4_;
                        auVar218._4_4_ = (float)local_5b40._4_4_ * auVar140._4_4_;
                        auVar218._8_4_ = fStack_5b38 * auVar140._8_4_;
                        auVar218._12_4_ = fStack_5b34 * auVar140._12_4_;
                        auVar54._16_4_ = fStack_5b30 * auVar140._16_4_;
                        auVar54._0_16_ = auVar218;
                        auVar54._20_4_ = fStack_5b2c * auVar140._20_4_;
                        auVar54._24_4_ = fStack_5b28 * auVar140._24_4_;
                        auVar54._28_4_ = auVar140._28_4_;
                        uVar110 = *(undefined4 *)((long)&local_5f20 + lVar104 * 4);
                        auVar236._4_4_ = uVar110;
                        auVar236._0_4_ = uVar110;
                        auVar236._8_4_ = uVar110;
                        auVar236._12_4_ = uVar110;
                        auVar236._16_4_ = uVar110;
                        auVar236._20_4_ = uVar110;
                        auVar236._24_4_ = uVar110;
                        auVar236._28_4_ = uVar110;
                        auVar140 = vsubps_avx(auVar236,auVar87);
                        auVar224._0_4_ = (float)local_5b20._0_4_ * auVar140._0_4_;
                        auVar224._4_4_ = (float)local_5b20._4_4_ * auVar140._4_4_;
                        auVar224._8_4_ = fStack_5b18 * auVar140._8_4_;
                        auVar224._12_4_ = fStack_5b14 * auVar140._12_4_;
                        auVar55._16_4_ = fStack_5b10 * auVar140._16_4_;
                        auVar55._0_16_ = auVar224;
                        auVar55._20_4_ = fStack_5b0c * auVar140._20_4_;
                        auVar55._24_4_ = fStack_5b08 * auVar140._24_4_;
                        auVar55._28_4_ = auVar140._28_4_;
                        auVar124 = vpminsd_avx(auVar50._16_16_,auVar53._16_16_);
                        auVar116 = vpminsd_avx(auVar123,auVar208);
                        auVar117 = vpminsd_avx(auVar51._16_16_,auVar54._16_16_);
                        auVar124 = vpmaxsd_avx(auVar124,auVar117);
                        auVar117 = vpminsd_avx(auVar157,auVar218);
                        auVar116 = vpmaxsd_avx(auVar116,auVar117);
                        auVar117 = vpminsd_avx(auVar174,auVar224);
                        auVar116 = vpmaxsd_avx(auVar116,auVar117);
                        auVar117 = vpminsd_avx(auVar52._16_16_,auVar55._16_16_);
                        auVar124 = vpmaxsd_avx(auVar124,auVar117);
                        auVar116 = vpmaxsd_avx(auVar116,local_5aa0._0_16_);
                        auVar124 = vpmaxsd_avx(auVar124,local_5aa0._16_16_);
                        auVar117 = vpmaxsd_avx(auVar50._16_16_,auVar53._16_16_);
                        auVar153 = vpmaxsd_avx(auVar123,auVar208);
                        auVar204 = vpmaxsd_avx(auVar51._16_16_,auVar54._16_16_);
                        auVar204 = vpminsd_avx(auVar117,auVar204);
                        auVar117 = vpmaxsd_avx(auVar157,auVar218);
                        auVar153 = vpminsd_avx(auVar153,auVar117);
                        auVar117 = vpmaxsd_avx(auVar174,auVar224);
                        auVar153 = vpminsd_avx(auVar153,auVar117);
                        auVar117 = vpmaxsd_avx(auVar52._16_16_,auVar55._16_16_);
                        auVar117 = vpminsd_avx(auVar204,auVar117);
                        auVar153 = vpminsd_avx(auVar153,local_5a80._0_16_);
                        auVar117 = vpminsd_avx(auVar117,local_5a80._16_16_);
                        auVar179._16_16_ = auVar124;
                        auVar179._0_16_ = auVar116;
                        auVar189 = ZEXT3264(auVar179);
                        auVar136._16_16_ = auVar117;
                        auVar136._0_16_ = auVar153;
                        auVar140 = vcmpps_avx(auVar179,auVar136,2);
                        auVar170 = ZEXT3264(auVar140);
                        auVar158 = auVar272._0_32_;
                        auVar140 = auVar158 & auVar140;
                        if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar140 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar140 >> 0x7f,0) == '\0')
                              && (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar140 >> 0xbf,0) == '\0') &&
                            (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar140[0x1f]) {
                          bVar113 = false;
                          auVar222 = ZEXT3264(local_60a0);
                        }
                        else {
                          local_5f28 = uVar101;
                          uVar5 = *(ushort *)(lVar100 + lVar104 * 8);
                          uVar6 = *(ushort *)(lVar100 + 2 + lVar104 * 8);
                          uVar97 = *(uint *)(lVar100 + 0x88);
                          uVar191 = *(uint *)(lVar100 + 4 + lVar104 * 8);
                          local_61c0._0_8_ = CONCAT44(0,uVar191);
                          pGVar7 = (context->scene->geometries).items[uVar97].ptr;
                          lVar104 = *(long *)&pGVar7->field_0x58;
                          lVar8 = *(long *)&pGVar7[1].time_range.upper;
                          lVar106 = CONCAT44(0,uVar191) *
                                    pGVar7[1].super_RefCount.refCounter.
                                    super___atomic_base<unsigned_long>._M_i;
                          uVar99 = uVar5 & 0x7fff;
                          uVar98 = uVar6 & 0x7fff;
                          uVar193 = *(uint *)(lVar104 + 4 + lVar106);
                          uVar101 = (ulong)uVar193;
                          uVar111 = (ulong)(uVar193 * uVar98 + *(int *)(lVar104 + lVar106) + uVar99)
                          ;
                          p_Var9 = pGVar7[1].intersectionFilterN;
                          puVar1 = (undefined8 *)(lVar8 + (long)p_Var9 * uVar111);
                          puVar2 = (undefined8 *)(lVar8 + (uVar111 + 1) * (long)p_Var9);
                          uStack_5a50 = *puVar2;
                          uStack_5a48 = puVar2[1];
                          lVar100 = uVar111 + uVar101;
                          local_5a30 = *(undefined1 (*) [16])(lVar8 + lVar100 * (long)p_Var9);
                          auVar189 = ZEXT1664(local_5a30);
                          lVar107 = uVar111 + uVar101 + 1;
                          puVar2 = (undefined8 *)(lVar8 + lVar107 * (long)p_Var9);
                          local_5a40 = *puVar2;
                          uStack_5a38 = puVar2[1];
                          uVar105 = (ulong)(-1 < (short)uVar5);
                          puVar2 = (undefined8 *)(lVar8 + (uVar111 + uVar105 + 1) * (long)p_Var9);
                          lVar102 = uVar105 + lVar107;
                          puVar3 = (undefined8 *)(lVar8 + lVar102 * (long)p_Var9);
                          local_5a00 = *puVar3;
                          uStack_59f8 = puVar3[1];
                          if ((short)uVar6 < 0) {
                            uVar101 = 0;
                          }
                          puVar3 = (undefined8 *)(lVar8 + (lVar100 + uVar101) * (long)p_Var9);
                          puVar4 = (undefined8 *)(lVar8 + (lVar107 + uVar101) * (long)p_Var9);
                          local_59c0 = *puVar4;
                          uStack_59b8 = puVar4[1];
                          puVar4 = (undefined8 *)(lVar8 + (uVar101 + lVar102) * (long)p_Var9);
                          local_5a60 = *puVar1;
                          uStack_5a58 = puVar1[1];
                          local_5a20 = uStack_5a50;
                          uStack_5a18 = uStack_5a48;
                          local_5a10 = *puVar2;
                          uStack_5a08 = puVar2[1];
                          local_59f0 = local_5a40;
                          uStack_59e8 = uStack_5a38;
                          local_59e0 = local_5a30;
                          local_59d0 = local_5a40;
                          uStack_59c8 = uStack_5a38;
                          local_59b0 = *puVar3;
                          uStack_59a8 = puVar3[1];
                          local_59a0 = local_5a40;
                          uStack_5998 = uStack_5a38;
                          local_5990 = local_5a00;
                          uStack_5988 = uStack_59f8;
                          local_5980 = *puVar4;
                          uStack_5978 = puVar4[1];
                          local_5970 = local_59c0;
                          uStack_5968 = uStack_59b8;
                          local_5c90 = vshufps_avx(ZEXT416(uVar97),ZEXT416(uVar97),0);
                          local_5ca0 = vshufps_avx(ZEXT416(uVar191),ZEXT416(uVar191),0);
                          auVar170 = ZEXT1664(local_5ca0);
                          pfVar103 = (float *)(local_5a30 + 8);
                          unaff_R14 = 0;
                          auVar271 = ZEXT3264(auVar158);
                          auVar245 = ZEXT3264((undefined1  [32])_local_6140);
                          auVar252 = ZEXT3264(local_6160);
                          auVar251 = ZEXT3264((undefined1  [32])local_6080);
                          auVar222 = ZEXT3264(local_60a0);
                          local_5fe0 = auVar158;
                          local_61f0 = lVar106;
                          local_61e8 = lVar104;
                          do {
                            aVar250 = auVar251._0_32_;
                            auVar140 = auVar252._0_32_;
                            local_61e0 = auVar271._0_32_;
                            _local_6140 = auVar245._0_32_;
                            auVar158 = auVar272._0_32_;
                            local_6160 = auVar140;
                            local_6080 = aVar250;
                            if (unaff_R14 == 4) break;
                            auVar213 = auVar222._0_32_;
                            local_60a0 = auVar213;
                            fVar145 = pfVar103[-0xe];
                            auVar180._4_4_ = fVar145;
                            auVar180._0_4_ = fVar145;
                            auVar180._8_4_ = fVar145;
                            auVar180._12_4_ = fVar145;
                            auVar180._16_4_ = fVar145;
                            auVar180._20_4_ = fVar145;
                            auVar180._24_4_ = fVar145;
                            auVar180._28_4_ = fVar145;
                            fVar146 = pfVar103[-0xd];
                            auVar137._4_4_ = fVar146;
                            auVar137._0_4_ = fVar146;
                            auVar137._8_4_ = fVar146;
                            auVar137._12_4_ = fVar146;
                            auVar137._16_4_ = fVar146;
                            auVar137._20_4_ = fVar146;
                            auVar137._24_4_ = fVar146;
                            auVar137._28_4_ = fVar146;
                            fVar147 = pfVar103[-0xc];
                            auVar214._4_4_ = fVar147;
                            auVar214._0_4_ = fVar147;
                            auVar214._8_4_ = fVar147;
                            auVar214._12_4_ = fVar147;
                            auVar214._16_4_ = fVar147;
                            auVar214._20_4_ = fVar147;
                            auVar214._24_4_ = fVar147;
                            auVar214._28_4_ = fVar147;
                            local_5d20._4_4_ = pfVar103[-10];
                            local_5840 = pfVar103[-9];
                            local_5860 = pfVar103[-8];
                            local_5880 = pfVar103[-2];
                            local_58a0 = pfVar103[-1];
                            local_58c0 = *pfVar103;
                            local_5d20._0_4_ = local_5d20._4_4_;
                            fStack_5d18 = (float)local_5d20._4_4_;
                            fStack_5d14 = (float)local_5d20._4_4_;
                            fStack_5d10 = (float)local_5d20._4_4_;
                            fStack_5d0c = (float)local_5d20._4_4_;
                            fStack_5d08 = (float)local_5d20._4_4_;
                            fStack_5d04 = (float)local_5d20._4_4_;
                            fVar40 = fVar145 - (float)local_5d20._4_4_;
                            fStack_583c = local_5840;
                            fStack_5838 = local_5840;
                            fStack_5834 = local_5840;
                            fStack_5830 = local_5840;
                            fStack_582c = local_5840;
                            fStack_5828 = local_5840;
                            fStack_5824 = local_5840;
                            fVar41 = fVar146 - local_5840;
                            fStack_585c = local_5860;
                            fStack_5858 = local_5860;
                            fStack_5854 = local_5860;
                            fStack_5850 = local_5860;
                            fStack_584c = local_5860;
                            fStack_5848 = local_5860;
                            fStack_5844 = local_5860;
                            fVar42 = fVar147 - local_5860;
                            fStack_589c = local_58a0;
                            fStack_5898 = local_58a0;
                            fStack_5894 = local_58a0;
                            fStack_5890 = local_58a0;
                            fStack_588c = local_58a0;
                            fStack_5888 = local_58a0;
                            fStack_5884 = local_58a0;
                            fVar146 = local_58a0 - fVar146;
                            fStack_58bc = local_58c0;
                            fStack_58b8 = local_58c0;
                            fStack_58b4 = local_58c0;
                            fStack_58b0 = local_58c0;
                            fStack_58ac = local_58c0;
                            fStack_58a8 = local_58c0;
                            fStack_58a4 = local_58c0;
                            fVar147 = local_58c0 - fVar147;
                            auVar117 = ZEXT416((uint)(fVar146 * fVar42 - fVar147 * fVar41));
                            local_60e0._0_16_ = auVar117;
                            fStack_587c = local_5880;
                            fStack_5878 = local_5880;
                            fStack_5874 = local_5880;
                            fStack_5870 = local_5880;
                            fStack_586c = local_5880;
                            fStack_5868 = local_5880;
                            fStack_5864 = local_5880;
                            fVar43 = local_5880 - fVar145;
                            local_5ee0._0_16_ = ZEXT416((uint)fVar42);
                            local_5cc0 = ZEXT416((uint)fVar40);
                            local_5cb0 = ZEXT416((uint)fVar41);
                            local_5ef0 = local_5c90._0_8_;
                            uStack_5ee8 = local_5c90._8_8_;
                            local_5f00 = local_5ca0._0_8_;
                            uStack_5ef8 = local_5ca0._8_8_;
                            auVar158 = *(undefined1 (*) [32])(ray + 0x20);
                            local_5d40 = auVar158;
                            auVar36 = vsubps_avx(auVar137,auVar158);
                            auVar211 = *(undefined1 (*) [32])(ray + 0x40);
                            local_5d60 = auVar211;
                            auVar37 = vsubps_avx(auVar214,auVar211);
                            fVar14 = *(float *)(ray + 0xa0);
                            fVar15 = *(float *)(ray + 0xa4);
                            fVar17 = *(float *)(ray + 0xa8);
                            fVar18 = *(float *)(ray + 0xac);
                            fVar19 = *(float *)(ray + 0xb0);
                            fVar20 = *(float *)(ray + 0xb4);
                            fVar21 = *(float *)(ray + 0xb8);
                            fVar243 = auVar37._0_4_;
                            fVar255 = auVar37._4_4_;
                            auVar56._4_4_ = fVar255 * fVar15;
                            auVar56._0_4_ = fVar243 * fVar14;
                            fVar257 = auVar37._8_4_;
                            auVar56._8_4_ = fVar257 * fVar17;
                            fVar258 = auVar37._12_4_;
                            auVar56._12_4_ = fVar258 * fVar18;
                            fVar259 = auVar37._16_4_;
                            auVar56._16_4_ = fVar259 * fVar19;
                            fVar260 = auVar37._20_4_;
                            auVar56._20_4_ = fVar260 * fVar20;
                            fVar261 = auVar37._24_4_;
                            auVar56._24_4_ = fVar261 * fVar21;
                            auVar56._28_4_ = auVar211._28_4_;
                            fVar23 = *(float *)(ray + 0xc0);
                            fVar24 = *(float *)(ray + 0xc4);
                            fVar25 = *(float *)(ray + 200);
                            fVar26 = *(float *)(ray + 0xcc);
                            fVar27 = *(float *)(ray + 0xd0);
                            fVar28 = *(float *)(ray + 0xd4);
                            fVar30 = *(float *)(ray + 0xd8);
                            fVar200 = auVar36._0_4_;
                            fVar231 = auVar36._4_4_;
                            auVar57._4_4_ = fVar231 * fVar24;
                            auVar57._0_4_ = fVar200 * fVar23;
                            fVar238 = auVar36._8_4_;
                            auVar57._8_4_ = fVar238 * fVar25;
                            fVar239 = auVar36._12_4_;
                            auVar57._12_4_ = fVar239 * fVar26;
                            fVar240 = auVar36._16_4_;
                            auVar57._16_4_ = fVar240 * fVar27;
                            fVar241 = auVar36._20_4_;
                            auVar57._20_4_ = fVar241 * fVar28;
                            fVar242 = auVar36._24_4_;
                            auVar57._24_4_ = fVar242 * fVar30;
                            auVar57._28_4_ = auVar158._28_4_;
                            auVar38 = vsubps_avx(auVar57,auVar56);
                            auVar36 = *(undefined1 (*) [32])ray;
                            local_5d80 = auVar36;
                            auVar37 = vsubps_avx(auVar180,auVar36);
                            fVar31 = *(float *)(ray + 0x80);
                            fVar32 = *(float *)(ray + 0x84);
                            fVar33 = *(float *)(ray + 0x88);
                            fVar34 = *(float *)(ray + 0x8c);
                            fVar35 = *(float *)(ray + 0x90);
                            fVar171 = *(float *)(ray + 0x94);
                            fVar190 = *(float *)(ray + 0x98);
                            fVar149 = auVar37._0_4_;
                            fVar148 = auVar37._4_4_;
                            auVar58._4_4_ = fVar24 * fVar148;
                            auVar58._0_4_ = fVar23 * fVar149;
                            fVar114 = auVar37._8_4_;
                            auVar58._8_4_ = fVar25 * fVar114;
                            fVar12 = auVar37._12_4_;
                            auVar58._12_4_ = fVar26 * fVar12;
                            fVar16 = auVar37._16_4_;
                            auVar58._16_4_ = fVar27 * fVar16;
                            fVar22 = auVar37._20_4_;
                            auVar58._20_4_ = fVar28 * fVar22;
                            fVar29 = auVar37._24_4_;
                            auVar58._24_4_ = fVar30 * fVar29;
                            auVar58._28_4_ = auVar158._28_4_;
                            auVar228._0_4_ = fVar243 * fVar31;
                            auVar228._4_4_ = fVar255 * fVar32;
                            auVar228._8_4_ = fVar257 * fVar33;
                            auVar228._12_4_ = fVar258 * fVar34;
                            auVar228._16_4_ = fVar259 * fVar35;
                            auVar228._20_4_ = fVar260 * fVar171;
                            auVar228._24_4_ = fVar261 * fVar190;
                            auVar228._28_4_ = 0;
                            auVar125 = vsubps_avx(auVar228,auVar58);
                            auVar59._4_4_ = fVar231 * fVar32;
                            auVar59._0_4_ = fVar200 * fVar31;
                            auVar59._8_4_ = fVar238 * fVar33;
                            auVar59._12_4_ = fVar239 * fVar34;
                            auVar59._16_4_ = fVar240 * fVar35;
                            auVar59._20_4_ = fVar241 * fVar171;
                            auVar59._24_4_ = fVar242 * fVar190;
                            auVar59._28_4_ = 0;
                            auVar60._4_4_ = fVar148 * fVar15;
                            auVar60._0_4_ = fVar149 * fVar14;
                            auVar60._8_4_ = fVar114 * fVar17;
                            auVar60._12_4_ = fVar12 * fVar18;
                            auVar60._16_4_ = fVar16 * fVar19;
                            auVar60._20_4_ = fVar22 * fVar20;
                            auVar60._24_4_ = fVar29 * fVar21;
                            auVar60._28_4_ = fVar145;
                            local_5940 = vsubps_avx(auVar60,auVar59);
                            auVar124 = ZEXT416((uint)(fVar40 * fVar147 - fVar43 * fVar42));
                            auVar124 = vshufps_avx(auVar124,auVar124,0);
                            aVar229._16_16_ = auVar124;
                            aVar229._0_16_ = auVar124;
                            auVar116 = ZEXT416((uint)(fVar43 * fVar41 - fVar40 * fVar146));
                            auVar116 = vshufps_avx(auVar116,auVar116,0);
                            local_61c0._16_16_ = auVar116;
                            local_61c0._0_16_ = auVar116;
                            local_5ec0 = *(ulong *)(ray + 0xc0);
                            uStack_5eb8 = *(undefined8 *)(ray + 200);
                            uStack_5eb0 = *(undefined8 *)(ray + 0xd0);
                            uStack_5ea8 = *(undefined8 *)(ray + 0xd8);
                            fVar151 = auVar116._0_4_;
                            fVar150 = auVar116._4_4_;
                            fVar144 = auVar116._8_4_;
                            fVar13 = auVar116._12_4_;
                            local_5fa0 = *(undefined8 *)(ray + 0xa0);
                            uStack_5f98 = *(undefined8 *)(ray + 0xa8);
                            uStack_5f90 = *(undefined8 *)(ray + 0xb0);
                            uStack_5f88 = *(undefined8 *)(ray + 0xb8);
                            fVar192 = auVar124._0_4_;
                            fVar194 = auVar124._4_4_;
                            fVar196 = auVar124._8_4_;
                            fVar198 = auVar124._12_4_;
                            auVar153 = vpermilps_avx(auVar117,0);
                            local_5fc0 = *(undefined8 *)(ray + 0x80);
                            uStack_5fb8 = *(undefined8 *)(ray + 0x88);
                            uStack_5fb0 = *(undefined8 *)(ray + 0x90);
                            uStack_5fa8 = *(undefined8 *)(ray + 0x98);
                            fVar262 = auVar153._0_4_;
                            fVar264 = auVar153._4_4_;
                            fVar265 = auVar153._8_4_;
                            auVar247._0_4_ = fVar262 * fVar31 + fVar192 * fVar14 + fVar23 * fVar151;
                            auVar247._4_4_ = fVar264 * fVar32 + fVar194 * fVar15 + fVar24 * fVar150;
                            auVar247._8_4_ = fVar265 * fVar33 + fVar196 * fVar17 + fVar25 * fVar144;
                            auVar247._12_4_ =
                                 auVar153._12_4_ * fVar34 + fVar198 * fVar18 + fVar26 * fVar13;
                            auVar247._16_4_ = fVar262 * fVar35 + fVar192 * fVar19 + fVar27 * fVar151
                            ;
                            auVar247._20_4_ =
                                 fVar264 * fVar171 + fVar194 * fVar20 + fVar28 * fVar150;
                            auVar247._24_4_ =
                                 fVar265 * fVar190 + fVar196 * fVar21 + fVar30 * fVar144;
                            auVar247._28_4_ = fVar145 + fVar13 + 0.0;
                            auVar124 = vshufps_avx(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),0);
                            auVar116 = vshufps_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),0);
                            auVar117 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
                            auVar181._8_4_ = 0x80000000;
                            auVar181._0_8_ = 0x8000000080000000;
                            auVar181._12_4_ = 0x80000000;
                            auVar181._16_4_ = 0x80000000;
                            auVar181._20_4_ = 0x80000000;
                            auVar181._24_4_ = 0x80000000;
                            auVar181._28_4_ = 0x80000000;
                            auVar37 = vandps_avx(auVar247,auVar181);
                            uVar97 = auVar37._0_4_;
                            local_60e0._0_4_ =
                                 uVar97 ^ (uint)(auVar117._0_4_ * auVar38._0_4_ +
                                                auVar125._0_4_ * auVar124._0_4_ +
                                                auVar116._0_4_ * local_5940._0_4_);
                            uVar191 = auVar37._4_4_;
                            local_60e0._4_4_ =
                                 uVar191 ^ (uint)(auVar117._4_4_ * auVar38._4_4_ +
                                                 auVar125._4_4_ * auVar124._4_4_ +
                                                 auVar116._4_4_ * local_5940._4_4_);
                            uVar193 = auVar37._8_4_;
                            local_60e0._8_4_ =
                                 uVar193 ^ (uint)(auVar117._8_4_ * auVar38._8_4_ +
                                                 auVar125._8_4_ * auVar124._8_4_ +
                                                 auVar116._8_4_ * local_5940._8_4_);
                            uVar195 = auVar37._12_4_;
                            local_60e0._12_4_ =
                                 uVar195 ^ (uint)(auVar117._12_4_ * auVar38._12_4_ +
                                                 auVar125._12_4_ * auVar124._12_4_ +
                                                 auVar116._12_4_ * local_5940._12_4_);
                            uVar197 = auVar37._16_4_;
                            local_60e0._16_4_ =
                                 uVar197 ^ (uint)(auVar117._0_4_ * auVar38._16_4_ +
                                                 auVar125._16_4_ * auVar124._0_4_ +
                                                 auVar116._0_4_ * local_5940._16_4_);
                            uVar199 = auVar37._20_4_;
                            local_60e0._20_4_ =
                                 uVar199 ^ (uint)(auVar117._4_4_ * auVar38._20_4_ +
                                                 auVar125._20_4_ * auVar124._4_4_ +
                                                 auVar116._4_4_ * local_5940._20_4_);
                            uVar201 = auVar37._24_4_;
                            local_60e0._24_4_ =
                                 uVar201 ^ (uint)(auVar117._8_4_ * auVar38._24_4_ +
                                                 auVar125._24_4_ * auVar124._8_4_ +
                                                 auVar116._8_4_ * local_5940._24_4_);
                            uVar202 = auVar37._28_4_;
                            local_60e0._28_4_ =
                                 uVar202 ^ (uint)(auVar117._12_4_ +
                                                 auVar124._12_4_ + auVar116._12_4_);
                            auVar37 = vcmpps_avx(local_60e0,_DAT_01f7b000,5);
                            auVar212 = local_61e0 & auVar37;
                            local_58e0 = pfVar103[-6];
                            fStack_58dc = local_58e0;
                            fStack_58d8 = local_58e0;
                            fStack_58d4 = local_58e0;
                            fStack_58d0 = local_58e0;
                            fStack_58cc = local_58e0;
                            fStack_58c8 = local_58e0;
                            fStack_58c4 = local_58e0;
                            local_5900 = pfVar103[-5];
                            fStack_58fc = local_5900;
                            fStack_58f8 = local_5900;
                            fStack_58f4 = local_5900;
                            fStack_58f0 = local_5900;
                            fStack_58ec = local_5900;
                            fStack_58e8 = local_5900;
                            fStack_58e4 = local_5900;
                            local_5920 = pfVar103[-4];
                            fStack_591c = local_5920;
                            fStack_5918 = local_5920;
                            fStack_5914 = local_5920;
                            fStack_5910 = local_5920;
                            fStack_590c = local_5920;
                            fStack_5908 = local_5920;
                            fStack_5904 = local_5920;
                            uStack_6138 = auVar245._8_8_;
                            uStack_6130 = auVar245._16_8_;
                            uStack_6128 = auVar245._24_8_;
                            _local_6140 = auVar245._0_8_;
                            local_5ee0 = _local_6120;
                            local_6000._0_8_ = _local_6140;
                            local_6000._8_8_ = uStack_6138;
                            local_6000._16_8_ = uStack_6130;
                            local_6000._24_8_ = uStack_6128;
                            if ((((((((auVar212 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar212 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar212 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar212 >> 0x7f,0) == '\0') &&
                                  (auVar212 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar212 >> 0xbf,0) == '\0') &&
                                (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar212[0x1f]) {
LAB_0103c5f1:
                              auVar237._8_8_ = uStack_6018;
                              auVar237._0_8_ = local_6020;
                              auVar237._16_8_ = uStack_6010;
                              auVar237._24_8_ = uStack_6008;
                              auVar172 = ZEXT436(auVar37._28_4_);
                              local_61c0 = local_6100;
                            }
                            else {
                              auVar124 = vpermilps_avx(ZEXT416((uint)fVar40),0);
                              auVar116 = vpermilps_avx(ZEXT416((uint)fVar41),0);
                              auVar117 = vpermilps_avx(ZEXT416((uint)fVar42),0);
                              auVar37 = vandps_avx(auVar37,local_61e0);
                              auVar215._0_4_ =
                                   uVar97 ^ (uint)(auVar124._0_4_ * auVar38._0_4_ +
                                                  auVar125._0_4_ * auVar116._0_4_ +
                                                  auVar117._0_4_ * local_5940._0_4_);
                              auVar215._4_4_ =
                                   uVar191 ^ (uint)(auVar124._4_4_ * auVar38._4_4_ +
                                                   auVar125._4_4_ * auVar116._4_4_ +
                                                   auVar117._4_4_ * local_5940._4_4_);
                              auVar215._8_4_ =
                                   uVar193 ^ (uint)(auVar124._8_4_ * auVar38._8_4_ +
                                                   auVar125._8_4_ * auVar116._8_4_ +
                                                   auVar117._8_4_ * local_5940._8_4_);
                              auVar215._12_4_ =
                                   uVar195 ^ (uint)(auVar124._12_4_ * auVar38._12_4_ +
                                                   auVar125._12_4_ * auVar116._12_4_ +
                                                   auVar117._12_4_ * local_5940._12_4_);
                              auVar215._16_4_ =
                                   uVar197 ^ (uint)(auVar124._0_4_ * auVar38._16_4_ +
                                                   auVar125._16_4_ * auVar116._0_4_ +
                                                   auVar117._0_4_ * local_5940._16_4_);
                              auVar215._20_4_ =
                                   uVar199 ^ (uint)(auVar124._4_4_ * auVar38._20_4_ +
                                                   auVar125._20_4_ * auVar116._4_4_ +
                                                   auVar117._4_4_ * local_5940._20_4_);
                              auVar215._24_4_ =
                                   uVar201 ^ (uint)(auVar124._8_4_ * auVar38._24_4_ +
                                                   auVar125._24_4_ * auVar116._8_4_ +
                                                   auVar117._8_4_ * local_5940._24_4_);
                              auVar215._28_4_ =
                                   uVar202 ^ (uint)(auVar38._28_4_ + local_5940._28_4_ + fVar198);
                              auVar38 = vcmpps_avx(auVar215,_DAT_01f7b000,5);
                              auVar125 = auVar37 & auVar38;
                              if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar125 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar125 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar125 >> 0x7f,0) == '\0')
                                    && (auVar125 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar125 >> 0xbf,0) == '\0')
                                  && (auVar125 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar125[0x1f])
                              goto LAB_0103c5f1;
                              auVar186._8_4_ = 0x7fffffff;
                              auVar186._0_8_ = 0x7fffffff7fffffff;
                              auVar186._12_4_ = 0x7fffffff;
                              auVar186._16_4_ = 0x7fffffff;
                              auVar186._20_4_ = 0x7fffffff;
                              auVar186._24_4_ = 0x7fffffff;
                              auVar186._28_4_ = 0x7fffffff;
                              auVar125 = vandps_avx(auVar247,auVar186);
                              auVar37 = vandps_avx(auVar38,auVar37);
                              auVar38 = vsubps_avx(auVar125,local_60e0);
                              auVar38 = vcmpps_avx(auVar38,auVar215,5);
                              auVar172 = ZEXT436((uint)auVar38._28_4_);
                              auVar212 = auVar37 & auVar38;
                              if ((((((((auVar212 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar212 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar212 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar212 >> 0x7f,0) == '\0')
                                    && (auVar212 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar212 >> 0xbf,0) == '\0')
                                  && (auVar212 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar212[0x1f]) {
                                auVar237._8_8_ = uStack_6018;
                                auVar237._0_8_ = local_6020;
                                auVar237._16_8_ = uStack_6010;
                                auVar237._24_8_ = uStack_6008;
                                local_61c0 = local_6100;
                                auVar140 = local_6160;
                                aVar250 = local_6080;
                                auVar213 = local_60a0;
                              }
                              else {
                                auVar37 = vandps_avx(auVar38,auVar37);
                                fVar145 = local_60c0.v[7];
                                fVar146 = fVar145 + fVar145 + auVar38._28_4_;
                                local_5ee0._0_4_ =
                                     uVar97 ^ (uint)(fVar149 * fVar262 +
                                                    fVar192 * fVar200 + fVar243 * fVar151);
                                local_5ee0._4_4_ =
                                     uVar191 ^ (uint)(fVar148 * fVar264 +
                                                     fVar194 * fVar231 + fVar255 * fVar150);
                                local_5ee0._8_4_ =
                                     uVar193 ^ (uint)(fVar114 * fVar265 +
                                                     fVar196 * fVar238 + fVar257 * fVar144);
                                local_5ee0._12_4_ =
                                     uVar195 ^ (uint)(fVar12 * auVar153._12_4_ +
                                                     fVar198 * fVar239 + fVar258 * fVar13);
                                local_5ee0._16_4_ =
                                     uVar197 ^ (uint)(fVar16 * fVar262 +
                                                     fVar192 * fVar240 + fVar259 * fVar151);
                                local_5ee0._20_4_ =
                                     uVar199 ^ (uint)(fVar22 * fVar264 +
                                                     fVar194 * fVar241 + fVar260 * fVar150);
                                local_5ee0._24_4_ =
                                     uVar201 ^ (uint)(fVar29 * fVar265 +
                                                     fVar196 * fVar242 + fVar261 * fVar144);
                                local_5ee0._28_4_ = uVar202 ^ (uint)fVar146;
                                auVar78._4_4_ = auVar125._4_4_ * *(float *)(ray + 100);
                                auVar78._0_4_ = auVar125._0_4_ * *(float *)(ray + 0x60);
                                auVar78._8_4_ = auVar125._8_4_ * *(float *)(ray + 0x68);
                                auVar78._12_4_ = auVar125._12_4_ * *(float *)(ray + 0x6c);
                                auVar78._16_4_ = auVar125._16_4_ * *(float *)(ray + 0x70);
                                auVar78._20_4_ = auVar125._20_4_ * *(float *)(ray + 0x74);
                                auVar78._24_4_ = auVar125._24_4_ * *(float *)(ray + 0x78);
                                auVar78._28_4_ = fVar146;
                                auVar79._4_4_ = auVar125._4_4_ * *(float *)(ray + 0x104);
                                auVar79._0_4_ = auVar125._0_4_ * *(float *)(ray + 0x100);
                                auVar79._8_4_ = auVar125._8_4_ * *(float *)(ray + 0x108);
                                auVar79._12_4_ = auVar125._12_4_ * *(float *)(ray + 0x10c);
                                auVar79._16_4_ = auVar125._16_4_ * *(float *)(ray + 0x110);
                                auVar79._20_4_ = auVar125._20_4_ * *(float *)(ray + 0x114);
                                auVar79._24_4_ = auVar125._24_4_ * *(float *)(ray + 0x118);
                                auVar79._28_4_ = fVar145;
                                auVar38 = vcmpps_avx(auVar78,local_5ee0,1);
                                auVar212 = vcmpps_avx(local_5ee0,auVar79,2);
                                auVar38 = vandps_avx(auVar212,auVar38);
                                auVar212 = auVar37 & auVar38;
                                if ((((((((auVar212 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar212 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar212 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar212 >> 0x7f,0) != '\0'
                                       ) || (auVar212 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                     SUB321(auVar212 >> 0xbf,0) != '\0') ||
                                    (auVar212 & (undefined1  [32])0x100000000) !=
                                    (undefined1  [32])0x0) || auVar212[0x1f] < '\0') {
                                  auVar37 = vandps_avx(auVar38,auVar37);
                                  auVar38 = vcmpps_avx(auVar247,_DAT_01f7b000,4);
                                  auVar172 = ZEXT436(auVar38._28_4_);
                                  auVar212 = auVar37 & auVar38;
                                  if ((((((((auVar212 >> 0x1f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar212 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar212 >> 0x5f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar212 >> 0x7f,0) != '\0') ||
                                        (auVar212 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || SUB321(auVar212 >> 0xbf,0) != '\0'
                                       ) || (auVar212 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) || auVar212[0x1f] < '\0') {
                                    auVar237 = vandps_avx(auVar38,auVar37);
                                    local_6000._0_8_ = auVar153._0_8_;
                                    local_6000._8_8_ = auVar153._8_8_;
                                    local_60c0 = aVar229;
                                    auVar140 = auVar125;
                                    aVar250 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                              local_60e0;
                                    auVar213 = auVar215;
                                    local_6000._0_8_ = local_6000._0_8_;
                                    local_6000._8_8_ = local_6000._8_8_;
                                    local_6000._16_8_ = local_6000._0_8_;
                                    local_6000._24_8_ = local_6000._8_8_;
                                    goto LAB_0103c609;
                                  }
                                }
                                auVar172 = ZEXT436(auVar38._28_4_);
                                auVar237._8_8_ = uStack_6018;
                                auVar237._0_8_ = local_6020;
                                auVar237._16_8_ = uStack_6010;
                                auVar237._24_8_ = uStack_6008;
                                local_61c0 = local_6100;
                                local_5ee0 = _local_6120;
                              }
                            }
LAB_0103c609:
                            local_6080.v = local_60c0.v;
                            local_60a0 = auVar140;
                            if ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar237 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar237 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar237 >> 0x7f,0) == '\0') &&
                                  (auVar237 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar237 >> 0xbf,0) == '\0') &&
                                (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar237[0x1f]) {
                              local_6160 = auVar213;
                              local_60e0 = (undefined1  [32])aVar250;
                            }
                            else {
                              fVar145 = (float)(int)(*(ushort *)(lVar104 + 8 + lVar106) - 1);
                              auVar124 = vrcpss_avx(ZEXT416((uint)fVar145),ZEXT416((uint)fVar145));
                              fVar146 = (float)(int)(*(ushort *)(lVar104 + 10 + lVar106) - 1);
                              auVar116 = ZEXT416((uint)(float)(int)(((uint)unaff_R14 & 1) + uVar99))
                              ;
                              auVar116 = vshufps_avx(auVar116,auVar116,0);
                              fVar147 = auVar140._0_4_;
                              fVar149 = auVar140._4_4_;
                              fVar151 = auVar140._8_4_;
                              fVar148 = auVar140._12_4_;
                              fVar150 = auVar140._16_4_;
                              fVar114 = auVar140._20_4_;
                              fVar144 = auVar140._24_4_;
                              auVar124 = ZEXT416((uint)(auVar124._0_4_ *
                                                       (2.0 - auVar124._0_4_ * fVar145)));
                              auVar124 = vshufps_avx(auVar124,auVar124,0);
                              auVar61._4_4_ =
                                   (aVar250.v[1] + fVar149 * auVar116._4_4_) * auVar124._4_4_;
                              auVar61._0_4_ =
                                   (aVar250.v[0] + fVar147 * auVar116._0_4_) * auVar124._0_4_;
                              auVar61._8_4_ =
                                   (aVar250.v[2] + fVar151 * auVar116._8_4_) * auVar124._8_4_;
                              auVar61._12_4_ =
                                   (aVar250.v[3] + fVar148 * auVar116._12_4_) * auVar124._12_4_;
                              auVar61._16_4_ =
                                   (aVar250.v[4] + fVar150 * auVar116._0_4_) * auVar124._0_4_;
                              auVar61._20_4_ =
                                   (aVar250.v[5] + fVar114 * auVar116._4_4_) * auVar124._4_4_;
                              auVar61._24_4_ =
                                   (aVar250.v[6] + fVar144 * auVar116._8_4_) * auVar124._8_4_;
                              auVar61._28_4_ = auVar124._12_4_;
                              auVar124 = vrcpss_avx(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146));
                              local_60e0 = vblendvps_avx((undefined1  [32])aVar250,auVar61,auVar237)
                              ;
                              auVar116 = ZEXT416((uint)(float)(int)(((uint)(unaff_R14 >> 1) &
                                                                    0x7fffffff) + uVar98));
                              auVar116 = vshufps_avx(auVar116,auVar116,0);
                              auVar124 = ZEXT416((uint)(auVar124._0_4_ *
                                                       (2.0 - auVar124._0_4_ * fVar146)));
                              auVar124 = vshufps_avx(auVar124,auVar124,0);
                              auVar62._4_4_ =
                                   (auVar213._4_4_ + fVar149 * auVar116._4_4_) * auVar124._4_4_;
                              auVar62._0_4_ =
                                   (auVar213._0_4_ + fVar147 * auVar116._0_4_) * auVar124._0_4_;
                              auVar62._8_4_ =
                                   (auVar213._8_4_ + fVar151 * auVar116._8_4_) * auVar124._8_4_;
                              auVar62._12_4_ =
                                   (auVar213._12_4_ + fVar148 * auVar116._12_4_) * auVar124._12_4_;
                              auVar62._16_4_ =
                                   (auVar213._16_4_ + fVar150 * auVar116._0_4_) * auVar124._0_4_;
                              auVar62._20_4_ =
                                   (auVar213._20_4_ + fVar114 * auVar116._4_4_) * auVar124._4_4_;
                              auVar62._24_4_ =
                                   (auVar213._24_4_ + fVar144 * auVar116._8_4_) * auVar124._8_4_;
                              auVar62._28_4_ = auVar124._12_4_;
                              local_6160 = vblendvps_avx(auVar213,auVar62,auVar237);
                              uVar105 = CONCAT44(0,*(uint *)((long)&local_5ef0 + unaff_R14 * 4));
                              pGVar7 = (context->scene->geometries).items[uVar105].ptr;
                              uVar97 = pGVar7->mask;
                              auVar138._4_4_ = uVar97;
                              auVar138._0_4_ = uVar97;
                              auVar138._8_4_ = uVar97;
                              auVar138._12_4_ = uVar97;
                              auVar138._16_4_ = uVar97;
                              auVar138._20_4_ = uVar97;
                              auVar138._24_4_ = uVar97;
                              auVar138._28_4_ = uVar97;
                              auVar37 = vandps_avx(auVar138,*(undefined1 (*) [32])(ray + 0x120));
                              auVar124 = vpcmpeqd_avx(auVar37._16_16_,ZEXT816(0));
                              auVar116 = vpcmpeqd_avx(auVar37._0_16_,ZEXT816(0));
                              auVar164._16_16_ = auVar124;
                              auVar164._0_16_ = auVar116;
                              uVar97 = auVar124._12_4_;
                              auVar172 = ZEXT436(uVar97);
                              auVar37 = vblendps_avx(ZEXT1632(auVar116),auVar164,0xf0);
                              auVar38 = auVar237 & ~auVar37;
                              if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar38 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar38 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar38 >> 0x7f,0) != '\0')
                                    || (auVar38 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar38 >> 0xbf,0) != '\0')
                                  || (auVar38 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar38[0x1f] < '\0') {
                                _auStack_613c = auVar245._4_28_;
                                local_6140 = (undefined1  [4])
                                             *(undefined4 *)((long)&local_5f00 + unaff_R14 * 4);
                                auVar221 = vandnps_avx(auVar37,auVar237);
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  local_5fc0 = CONCAT44(fVar32,uVar98);
                                  local_5fa0 = CONCAT44(fVar15,uVar99);
                                  auVar140 = vrcpps_avx(auVar140);
                                  fVar145 = auVar140._0_4_;
                                  fVar146 = auVar140._4_4_;
                                  auVar76._4_4_ = fVar149 * fVar146;
                                  auVar76._0_4_ = fVar147 * fVar145;
                                  fVar147 = auVar140._8_4_;
                                  auVar76._8_4_ = fVar151 * fVar147;
                                  fVar149 = auVar140._12_4_;
                                  auVar76._12_4_ = fVar148 * fVar149;
                                  fVar151 = auVar140._16_4_;
                                  auVar76._16_4_ = fVar150 * fVar151;
                                  fVar148 = auVar140._20_4_;
                                  auVar76._20_4_ = fVar114 * fVar148;
                                  fVar150 = auVar140._24_4_;
                                  auVar76._24_4_ = fVar144 * fVar150;
                                  auVar76._28_4_ = uVar97;
                                  auVar184._8_4_ = 0x3f800000;
                                  auVar184._0_8_ = 0x3f8000003f800000;
                                  auVar184._12_4_ = 0x3f800000;
                                  auVar184._16_4_ = 0x3f800000;
                                  auVar184._20_4_ = 0x3f800000;
                                  auVar184._24_4_ = 0x3f800000;
                                  auVar184._28_4_ = 0x3f800000;
                                  auVar158 = vsubps_avx(auVar184,auVar76);
                                  fVar145 = fVar145 + fVar145 * auVar158._0_4_;
                                  fVar146 = fVar146 + fVar146 * auVar158._4_4_;
                                  fVar147 = fVar147 + fVar147 * auVar158._8_4_;
                                  fVar149 = fVar149 + fVar149 * auVar158._12_4_;
                                  fVar151 = fVar151 + fVar151 * auVar158._16_4_;
                                  fVar148 = fVar148 + fVar148 * auVar158._20_4_;
                                  fVar150 = fVar150 + fVar150 * auVar158._24_4_;
                                  uStack_5e98 = local_6000._8_8_;
                                  local_5ea0 = (undefined1  [8])local_6000._0_8_;
                                  uStack_5e90 = local_6000._16_8_;
                                  uStack_5e88 = local_6000._24_8_;
                                  local_5e60 = local_61c0._0_8_;
                                  uStack_5e58 = local_61c0._8_8_;
                                  uStack_5e50 = local_61c0._16_8_;
                                  uStack_5e48 = local_61c0._24_8_;
                                  fStack_5e3c = local_5ee0._4_4_ * fVar146;
                                  local_5e40 = local_5ee0._0_4_ * fVar145;
                                  fStack_5e34 = local_5ee0._12_4_ * fVar149;
                                  fStack_5e38 = local_5ee0._8_4_ * fVar147;
                                  fStack_5e2c = local_5ee0._20_4_ * fVar148;
                                  fStack_5e30 = local_5ee0._16_4_ * fVar151;
                                  fStack_5e24 = auVar158._28_4_;
                                  fStack_5e28 = local_5ee0._24_4_ * fVar150;
                                  fStack_5e1c = local_6160._4_4_ * fVar146;
                                  local_5e20 = local_6160._0_4_ * fVar145;
                                  fStack_5e14 = local_6160._12_4_ * fVar149;
                                  fStack_5e18 = local_6160._8_4_ * fVar147;
                                  fStack_5e0c = local_6160._20_4_ * fVar148;
                                  fStack_5e10 = local_6160._16_4_ * fVar151;
                                  fStack_5e04 = auVar140._28_4_ + auVar158._28_4_;
                                  fStack_5e08 = local_6160._24_4_ * fVar150;
                                  fStack_5dfc = local_60e0._4_4_ * fVar146;
                                  local_5e00 = local_60e0._0_4_ * fVar145;
                                  fStack_5df8 = local_60e0._8_4_ * fVar147;
                                  fStack_5df4 = local_60e0._12_4_ * fVar149;
                                  fStack_5dec = local_60e0._20_4_ * fVar148;
                                  fStack_5df0 = local_60e0._16_4_ * fVar151;
                                  fStack_5de8 = local_60e0._24_4_ * fVar150;
                                  uStack_5de4 = 0x3f800000;
                                  local_61a0 = (undefined1  [8])local_5c80;
                                  uStack_6198 = (vfloat_impl<8> *)&local_5d00;
                                  uStack_6190 = (vfloat_impl<8> *)&local_5ce0;
                                  uStack_6188 = (vfloat_impl<8> *)&local_5f20;
                                  local_6100._0_8_ = pGVar7;
                                  local_6120 = (undefined1  [8])uVar105;
                                  local_5e80 = (undefined1  [32])local_60c0;
                                  local_60c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                               auVar221;
                                  std::
                                  _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                                  ::
                                  _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                                            ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                              *)local_61a0,
                                             (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                              *)local_5ea0);
                                  pRVar10 = context->user;
                                  local_5dd0 = vshufps_avx(ZEXT416((uint)local_6120._0_4_),
                                                           ZEXT416((uint)local_6120._0_4_),0);
                                  _fStack_5df0 = vshufps_avx(ZEXT416((uint)local_6140),
                                                             ZEXT416((uint)local_6140),0);
                                  local_5ea0._4_4_ = local_5c80[1];
                                  local_5ea0._0_4_ = local_5c80[0];
                                  uStack_5e98._4_4_ = local_5c80[3];
                                  uStack_5e98._0_4_ = local_5c80[2];
                                  uStack_5e90._4_4_ = fStack_5c6c;
                                  uStack_5e90._0_4_ = fStack_5c70;
                                  uStack_5e88._4_4_ = fStack_5c64;
                                  uStack_5e88._0_4_ = fStack_5c68;
                                  local_5e60 = local_5c40;
                                  uStack_5e58 = uStack_5c38;
                                  uStack_5e50 = uStack_5c30;
                                  uStack_5e48 = uStack_5c28;
                                  auVar124 = local_60c0._0_16_;
                                  _local_5e40 = CONCAT44(local_5f20.i[1],local_5f20.i[0]);
                                  _fStack_5e38 = CONCAT44(local_5f20.i[3],local_5f20.i[2]);
                                  _fStack_5e30 = CONCAT44(local_5f20.i[5],local_5f20.i[4]);
                                  _fStack_5e28 = CONCAT44(local_5f20.i[7],local_5f20.i[6]);
                                  _local_5e20 = local_5ce0._0_8_;
                                  _fStack_5e18 = local_5ce0._8_8_;
                                  _fStack_5e10 = local_5ce0._16_8_;
                                  _fStack_5e08 = local_5ce0._24_8_;
                                  _local_5e00 = _fStack_5df0;
                                  local_5de0 = local_5dd0;
                                  auVar140 = vcmpps_avx(ZEXT1632(local_5dd0),ZEXT1632(local_5dd0),
                                                        0xf);
                                  local_6030[1] = auVar140;
                                  *local_6030 = auVar140;
                                  local_5dc0 = pRVar10->instID[0];
                                  uStack_5dbc = local_5dc0;
                                  uStack_5db8 = local_5dc0;
                                  uStack_5db4 = local_5dc0;
                                  uStack_5db0 = local_5dc0;
                                  uStack_5dac = local_5dc0;
                                  uStack_5da8 = local_5dc0;
                                  uStack_5da4 = local_5dc0;
                                  local_5da0 = pRVar10->instPrimID[0];
                                  uStack_5d9c = local_5da0;
                                  uStack_5d98 = local_5da0;
                                  uStack_5d94 = local_5da0;
                                  uStack_5d90 = local_5da0;
                                  uStack_5d8c = local_5da0;
                                  uStack_5d88 = local_5da0;
                                  uStack_5d84 = local_5da0;
                                  _local_6140 = *(anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)
                                                 (ray + 0x100);
                                  auVar140 = vblendvps_avx((undefined1  [32])_local_6140,
                                                           (undefined1  [32])local_5d00,
                                                           (undefined1  [32])local_60c0);
                                  *(undefined1 (*) [32])(ray + 0x100) = auVar140;
                                  _local_6060 = (undefined1  [32])local_60c0;
                                  local_61a0 = (undefined1  [8])local_6060;
                                  uStack_6198 = *(vfloat_impl<8> **)(local_6100._0_8_ + 0x18);
                                  uStack_6190 = (vfloat_impl<8> *)context->user;
                                  uStack_6188 = (vfloat_impl<8> *)ray;
                                  local_6180 = (RTCHitN *)local_5ea0;
                                  local_6178 = 8;
                                  if (*(code **)(local_6100._0_8_ + 0x48) == (code *)0x0) {
                                    auVar116 = local_60c0._16_16_;
                                  }
                                  else {
                                    (**(code **)(local_6100._0_8_ + 0x48))(local_61a0);
                                    auVar116 = _auStack_6050;
                                    auVar124 = _local_6060;
                                  }
                                  auVar117 = vpcmpeqd_avx(auVar124,(undefined1  [16])0x0);
                                  auVar153 = vpcmpeqd_avx(auVar116,(undefined1  [16])0x0);
                                  auVar166._16_16_ = auVar153;
                                  auVar166._0_16_ = auVar117;
                                  auVar140 = vcmpps_avx(ZEXT1632(auVar153),ZEXT1632(auVar153),0xf);
                                  auVar158 = auVar140 & ~auVar166;
                                  uVar98 = (uint)(float)local_5fc0;
                                  uVar99 = (uint)(float)local_5fa0;
                                  if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar158 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar158 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar158 >> 0x7f,0) == '\0') &&
                                        (auVar158 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && SUB321(auVar158 >> 0xbf,0) == '\0'
                                       ) && (auVar158 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) && -1 < auVar158[0x1f]) {
                                    auVar221._0_4_ = auVar117._0_4_ ^ auVar140._0_4_;
                                    auVar221._4_4_ = auVar117._4_4_ ^ auVar140._4_4_;
                                    auVar221._8_4_ = auVar117._8_4_ ^ auVar140._8_4_;
                                    auVar221._12_4_ = auVar117._12_4_ ^ auVar140._12_4_;
                                    auVar221._16_4_ = auVar153._0_4_ ^ auVar140._16_4_;
                                    auVar221._20_4_ = auVar153._4_4_ ^ auVar140._20_4_;
                                    auVar221._24_4_ = auVar153._8_4_ ^ auVar140._24_4_;
                                    auVar221._28_4_ = auVar153._12_4_ ^ auVar140._28_4_;
                                  }
                                  else {
                                    p_Var9 = context->args->filter;
                                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        ((*(byte *)(local_6100._0_8_ + 0x3e) & 0x40) != 0)))) {
                                      (*p_Var9)((RTCFilterFunctionNArguments *)local_61a0);
                                      uVar98 = (uint)(float)local_5fc0;
                                      auVar124 = _local_6060;
                                      auVar116 = _auStack_6050;
                                      uVar99 = (uint)(float)local_5fa0;
                                    }
                                    auVar124 = vpcmpeqd_avx(auVar124,ZEXT816(0) << 0x40);
                                    auVar116 = vpcmpeqd_avx(auVar116,ZEXT816(0) << 0x40);
                                    auVar141._16_16_ = auVar116;
                                    auVar141._0_16_ = auVar124;
                                    auVar221._0_8_ = auVar124._0_8_ ^ 0xffffffffffffffff;
                                    auVar221._8_4_ = auVar124._8_4_ ^ 0xffffffff;
                                    auVar221._12_4_ = auVar124._12_4_ ^ 0xffffffff;
                                    auVar221._16_4_ = auVar116._0_4_ ^ 0xffffffff;
                                    auVar221._20_4_ = auVar116._4_4_ ^ 0xffffffff;
                                    auVar221._24_4_ = auVar116._8_4_ ^ 0xffffffff;
                                    auVar221._28_4_ = auVar116._12_4_ ^ 0xffffffff;
                                    auVar166._8_4_ = 0xff800000;
                                    auVar166._0_8_ = 0xff800000ff800000;
                                    auVar166._12_4_ = 0xff800000;
                                    auVar166._16_4_ = 0xff800000;
                                    auVar166._20_4_ = 0xff800000;
                                    auVar166._24_4_ = 0xff800000;
                                    auVar166._28_4_ = 0xff800000;
                                    auVar140 = vblendvps_avx(auVar166,*(undefined1 (*) [32])
                                                                       (uStack_6188 + 8),auVar141);
                                    *(undefined1 (*) [32])(uStack_6188 + 8) = auVar140;
                                  }
                                  uVar97 = auVar166._28_4_;
                                  auVar140 = vblendvps_avx((undefined1  [32])_local_6140,
                                                           *(undefined1 (*) [32])(ray + 0x100),
                                                           auVar221);
                                  *(undefined1 (*) [32])(ray + 0x100) = auVar140;
                                  auVar36 = *(undefined1 (*) [32])ray;
                                  auVar158 = *(undefined1 (*) [32])(ray + 0x20);
                                  auVar211 = *(undefined1 (*) [32])(ray + 0x40);
                                  local_5fc0 = *(undefined8 *)(ray + 0x80);
                                  uStack_5fb8 = *(undefined8 *)(ray + 0x88);
                                  uStack_5fb0 = *(undefined8 *)(ray + 0x90);
                                  uStack_5fa8 = *(undefined8 *)(ray + 0x98);
                                  local_5fa0 = *(undefined8 *)(ray + 0xa0);
                                  uStack_5f98 = *(undefined8 *)(ray + 0xa8);
                                  uStack_5f90 = *(undefined8 *)(ray + 0xb0);
                                  uStack_5f88 = *(undefined8 *)(ray + 0xb8);
                                  local_5ec0 = *(ulong *)(ray + 0xc0);
                                  uStack_5eb8 = *(undefined8 *)(ray + 200);
                                  uStack_5eb0 = *(undefined8 *)(ray + 0xd0);
                                  uStack_5ea8 = *(undefined8 *)(ray + 0xd8);
                                  lVar104 = local_61e8;
                                  lVar106 = local_61f0;
                                }
                                auVar172 = ZEXT436(uVar97);
                                local_61e0 = vandnps_avx(auVar221,local_61e0);
                              }
                            }
                            auVar213 = _local_5d20;
                            auVar89._4_4_ = fStack_58fc;
                            auVar89._0_4_ = local_5900;
                            auVar89._8_4_ = fStack_58f8;
                            auVar89._12_4_ = fStack_58f4;
                            auVar89._16_4_ = fStack_58f0;
                            auVar89._20_4_ = fStack_58ec;
                            auVar89._24_4_ = fStack_58e8;
                            auVar89._28_4_ = fStack_58e4;
                            auVar92._4_4_ = fStack_589c;
                            auVar92._0_4_ = local_58a0;
                            auVar92._8_4_ = fStack_5898;
                            auVar92._12_4_ = fStack_5894;
                            auVar92._16_4_ = fStack_5890;
                            auVar92._20_4_ = fStack_588c;
                            auVar92._24_4_ = fStack_5888;
                            auVar92._28_4_ = fStack_5884;
                            auVar140 = vsubps_avx(auVar89,auVar92);
                            auVar88._4_4_ = fStack_591c;
                            auVar88._0_4_ = local_5920;
                            auVar88._8_4_ = fStack_5918;
                            auVar88._12_4_ = fStack_5914;
                            auVar88._16_4_ = fStack_5910;
                            auVar88._20_4_ = fStack_590c;
                            auVar88._24_4_ = fStack_5908;
                            auVar88._28_4_ = fStack_5904;
                            auVar91._4_4_ = fStack_58bc;
                            auVar91._0_4_ = local_58c0;
                            auVar91._8_4_ = fStack_58b8;
                            auVar91._12_4_ = fStack_58b4;
                            auVar91._16_4_ = fStack_58b0;
                            auVar91._20_4_ = fStack_58ac;
                            auVar91._24_4_ = fStack_58a8;
                            auVar91._28_4_ = fStack_58a4;
                            auVar37 = vsubps_avx(auVar88,auVar91);
                            auVar95._4_4_ = fStack_583c;
                            auVar95._0_4_ = local_5840;
                            auVar95._8_4_ = fStack_5838;
                            auVar95._12_4_ = fStack_5834;
                            auVar95._16_4_ = fStack_5830;
                            auVar95._20_4_ = fStack_582c;
                            auVar95._24_4_ = fStack_5828;
                            auVar95._28_4_ = fStack_5824;
                            auVar38 = vsubps_avx(auVar95,auVar89);
                            auVar94._4_4_ = fStack_585c;
                            auVar94._0_4_ = local_5860;
                            auVar94._8_4_ = fStack_5858;
                            auVar94._12_4_ = fStack_5854;
                            auVar94._16_4_ = fStack_5850;
                            auVar94._20_4_ = fStack_584c;
                            auVar94._24_4_ = fStack_5848;
                            auVar94._28_4_ = fStack_5844;
                            auVar125 = vsubps_avx(auVar94,auVar88);
                            fVar145 = auVar140._0_4_;
                            fVar255 = auVar125._0_4_;
                            fVar148 = auVar140._4_4_;
                            fVar257 = auVar125._4_4_;
                            auVar63._4_4_ = fVar257 * fVar148;
                            auVar63._0_4_ = fVar255 * fVar145;
                            fVar13 = auVar140._8_4_;
                            fVar258 = auVar125._8_4_;
                            auVar63._8_4_ = fVar258 * fVar13;
                            fVar41 = auVar140._12_4_;
                            fVar259 = auVar125._12_4_;
                            auVar63._12_4_ = fVar259 * fVar41;
                            fVar17 = auVar140._16_4_;
                            fVar260 = auVar125._16_4_;
                            auVar63._16_4_ = fVar260 * fVar17;
                            fVar23 = auVar140._20_4_;
                            fVar261 = auVar125._20_4_;
                            auVar63._20_4_ = fVar261 * fVar23;
                            fVar30 = auVar140._24_4_;
                            fVar262 = auVar125._24_4_;
                            auVar63._24_4_ = fVar262 * fVar30;
                            auVar63._28_4_ = fStack_5844;
                            fVar146 = auVar37._0_4_;
                            fVar171 = auVar38._0_4_;
                            auVar189._0_4_ = fVar171 * fVar146;
                            fVar150 = auVar37._4_4_;
                            fVar190 = auVar38._4_4_;
                            auVar189._4_4_ = fVar190 * fVar150;
                            fVar16 = auVar37._8_4_;
                            fVar192 = auVar38._8_4_;
                            auVar189._8_4_ = fVar192 * fVar16;
                            fVar42 = auVar37._12_4_;
                            fVar194 = auVar38._12_4_;
                            auVar189._12_4_ = fVar194 * fVar42;
                            fVar18 = auVar37._16_4_;
                            fVar196 = auVar38._16_4_;
                            auVar189._16_4_ = fVar196 * fVar18;
                            fVar24 = auVar37._20_4_;
                            fVar198 = auVar38._20_4_;
                            auVar189._20_4_ = fVar198 * fVar24;
                            fVar31 = auVar37._24_4_;
                            fVar200 = auVar38._24_4_;
                            auVar189._24_4_ = fVar200 * fVar31;
                            auVar189._28_36_ = auVar172;
                            _local_6140 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                          vsubps_avx(auVar189._0_32_,auVar63);
                            auVar90._4_4_ = fStack_58dc;
                            auVar90._0_4_ = local_58e0;
                            auVar90._8_4_ = fStack_58d8;
                            auVar90._12_4_ = fStack_58d4;
                            auVar90._16_4_ = fStack_58d0;
                            auVar90._20_4_ = fStack_58cc;
                            auVar90._24_4_ = fStack_58c8;
                            auVar90._28_4_ = fStack_58c4;
                            auVar93._4_4_ = fStack_587c;
                            auVar93._0_4_ = local_5880;
                            auVar93._8_4_ = fStack_5878;
                            auVar93._12_4_ = fStack_5874;
                            auVar93._16_4_ = fStack_5870;
                            auVar93._20_4_ = fStack_586c;
                            auVar93._24_4_ = fStack_5868;
                            auVar93._28_4_ = fStack_5864;
                            auVar140 = vsubps_avx(auVar90,auVar93);
                            auVar212 = vsubps_avx(_local_5d20,auVar90);
                            _local_5d20 = auVar37;
                            fVar264 = auVar212._0_4_;
                            fVar265 = auVar212._4_4_;
                            auVar64._4_4_ = fVar265 * fVar150;
                            auVar64._0_4_ = fVar264 * fVar146;
                            fVar266 = auVar212._8_4_;
                            auVar64._8_4_ = fVar266 * fVar16;
                            fVar267 = auVar212._12_4_;
                            auVar64._12_4_ = fVar267 * fVar42;
                            fVar268 = auVar212._16_4_;
                            auVar64._16_4_ = fVar268 * fVar18;
                            fVar269 = auVar212._20_4_;
                            auVar64._20_4_ = fVar269 * fVar24;
                            fVar28 = auVar213._28_4_;
                            fVar270 = auVar212._24_4_;
                            auVar64._24_4_ = fVar270 * fVar31;
                            auVar64._28_4_ = fVar28;
                            fVar147 = auVar140._0_4_;
                            fVar114 = auVar140._4_4_;
                            auVar65._4_4_ = fVar257 * fVar114;
                            auVar65._0_4_ = fVar255 * fVar147;
                            fVar22 = auVar140._8_4_;
                            auVar65._8_4_ = fVar258 * fVar22;
                            fVar43 = auVar140._12_4_;
                            auVar65._12_4_ = fVar259 * fVar43;
                            fVar19 = auVar140._16_4_;
                            auVar65._16_4_ = fVar260 * fVar19;
                            fVar25 = auVar140._20_4_;
                            auVar65._20_4_ = fVar261 * fVar25;
                            fVar32 = auVar140._24_4_;
                            auVar65._24_4_ = fVar262 * fVar32;
                            auVar65._28_4_ = auVar172._0_4_;
                            afVar39 = (__m256)vsubps_avx(auVar65,auVar64);
                            auVar66._4_4_ = fVar114 * fVar190;
                            auVar66._0_4_ = fVar147 * fVar171;
                            auVar66._8_4_ = fVar22 * fVar192;
                            auVar66._12_4_ = fVar43 * fVar194;
                            auVar66._16_4_ = fVar19 * fVar196;
                            auVar66._20_4_ = fVar25 * fVar198;
                            auVar66._24_4_ = fVar32 * fVar200;
                            auVar66._28_4_ = fVar28;
                            auVar67._4_4_ = fVar265 * fVar148;
                            auVar67._0_4_ = fVar264 * fVar145;
                            auVar67._8_4_ = fVar266 * fVar13;
                            auVar67._12_4_ = fVar267 * fVar41;
                            auVar67._16_4_ = fVar268 * fVar17;
                            auVar67._20_4_ = fVar269 * fVar23;
                            auVar67._24_4_ = fVar270 * fVar30;
                            auVar67._28_4_ = auVar172._0_4_;
                            local_6100 = vsubps_avx(auVar67,auVar66);
                            auVar37 = vsubps_avx(auVar90,auVar36);
                            auVar212 = vsubps_avx(auVar89,auVar158);
                            auVar230 = auVar212._4_12_;
                            auVar213 = vsubps_avx(auVar88,auVar211);
                            fVar231 = auVar213._0_4_;
                            fVar238 = auVar213._4_4_;
                            auVar68._4_4_ = fVar238 * local_5fa0._4_4_;
                            auVar68._0_4_ = fVar231 * (float)local_5fa0;
                            fVar239 = auVar213._8_4_;
                            auVar68._8_4_ = fVar239 * (float)uStack_5f98;
                            fVar240 = auVar213._12_4_;
                            auVar68._12_4_ = fVar240 * uStack_5f98._4_4_;
                            fVar241 = auVar213._16_4_;
                            auVar68._16_4_ = fVar241 * (float)uStack_5f90;
                            fVar242 = auVar213._20_4_;
                            auVar68._20_4_ = fVar242 * uStack_5f90._4_4_;
                            fVar243 = auVar213._24_4_;
                            auVar68._24_4_ = fVar243 * (float)uStack_5f88;
                            auVar68._28_4_ = fVar28;
                            fVar149 = auVar212._0_4_;
                            fVar144 = auVar212._4_4_;
                            auVar69._4_4_ = local_5ec0._4_4_ * fVar144;
                            auVar69._0_4_ = (float)local_5ec0 * fVar149;
                            fVar29 = auVar212._8_4_;
                            auVar69._8_4_ = (float)uStack_5eb8 * fVar29;
                            fVar14 = auVar212._12_4_;
                            auVar69._12_4_ = uStack_5eb8._4_4_ * fVar14;
                            fVar20 = auVar212._16_4_;
                            auVar69._16_4_ = (float)uStack_5eb0 * fVar20;
                            fVar26 = auVar212._20_4_;
                            auVar69._20_4_ = uStack_5eb0._4_4_ * fVar26;
                            fVar33 = auVar212._24_4_;
                            auVar69._24_4_ = (float)uStack_5ea8 * fVar33;
                            auVar69._28_4_ = auVar158._28_4_;
                            auVar158 = vsubps_avx(auVar69,auVar68);
                            fVar151 = auVar37._0_4_;
                            fVar12 = auVar37._4_4_;
                            auVar70._4_4_ = local_5ec0._4_4_ * fVar12;
                            auVar70._0_4_ = (float)local_5ec0 * fVar151;
                            fVar40 = auVar37._8_4_;
                            auVar70._8_4_ = (float)uStack_5eb8 * fVar40;
                            fVar15 = auVar37._12_4_;
                            auVar70._12_4_ = uStack_5eb8._4_4_ * fVar15;
                            fVar21 = auVar37._16_4_;
                            auVar70._16_4_ = (float)uStack_5eb0 * fVar21;
                            fVar27 = auVar37._20_4_;
                            auVar70._20_4_ = uStack_5eb0._4_4_ * fVar27;
                            fVar34 = auVar37._24_4_;
                            auVar70._24_4_ = (float)uStack_5ea8 * fVar34;
                            auVar70._28_4_ = fVar28;
                            auVar71._4_4_ = local_5fc0._4_4_ * fVar238;
                            auVar71._0_4_ = (float)local_5fc0 * fVar231;
                            auVar71._8_4_ = (float)uStack_5fb8 * fVar239;
                            auVar71._12_4_ = uStack_5fb8._4_4_ * fVar240;
                            auVar71._16_4_ = (float)uStack_5fb0 * fVar241;
                            auVar71._20_4_ = uStack_5fb0._4_4_ * fVar242;
                            auVar71._24_4_ = (float)uStack_5fa8 * fVar243;
                            auVar71._28_4_ = auVar211._28_4_;
                            auVar211 = vsubps_avx(auVar71,auVar70);
                            auVar72._4_4_ = local_5fc0._4_4_ * fVar144;
                            auVar72._0_4_ = (float)local_5fc0 * fVar149;
                            auVar72._8_4_ = (float)uStack_5fb8 * fVar29;
                            auVar72._12_4_ = uStack_5fb8._4_4_ * fVar14;
                            auVar72._16_4_ = (float)uStack_5fb0 * fVar20;
                            auVar72._20_4_ = uStack_5fb0._4_4_ * fVar26;
                            auVar72._24_4_ = (float)uStack_5fa8 * fVar33;
                            auVar72._28_4_ = fVar28;
                            auVar73._4_4_ = fVar12 * local_5fa0._4_4_;
                            auVar73._0_4_ = fVar151 * (float)local_5fa0;
                            auVar73._8_4_ = fVar40 * (float)uStack_5f98;
                            auVar73._12_4_ = fVar15 * uStack_5f98._4_4_;
                            auVar73._16_4_ = fVar21 * (float)uStack_5f90;
                            auVar73._20_4_ = fVar27 * uStack_5f90._4_4_;
                            auVar73._24_4_ = fVar34 * (float)uStack_5f88;
                            auVar73._28_4_ = auVar36._28_4_;
                            auVar254 = vsubps_avx(auVar73,auVar72);
                            auVar139._0_4_ =
                                 (float)local_5fc0 * (float)local_6140 +
                                 afVar39[0] * (float)local_5fa0 +
                                 (float)local_5ec0 * local_6100._0_4_;
                            auVar139._4_4_ =
                                 local_5fc0._4_4_ * (float)auStack_613c +
                                 afVar39[1] * local_5fa0._4_4_ + local_5ec0._4_4_ * local_6100._4_4_
                            ;
                            auVar139._8_4_ =
                                 (float)uStack_5fb8 * (float)uStack_6138 +
                                 afVar39[2] * (float)uStack_5f98 +
                                 (float)uStack_5eb8 * local_6100._8_4_;
                            auVar139._12_4_ =
                                 uStack_5fb8._4_4_ * uStack_6138._4_4_ +
                                 afVar39[3] * uStack_5f98._4_4_ +
                                 uStack_5eb8._4_4_ * local_6100._12_4_;
                            auVar139._16_4_ =
                                 (float)uStack_5fb0 * (float)uStack_6130 +
                                 afVar39[4] * (float)uStack_5f90 +
                                 (float)uStack_5eb0 * local_6100._16_4_;
                            auVar139._20_4_ =
                                 uStack_5fb0._4_4_ * uStack_6130._4_4_ +
                                 afVar39[5] * uStack_5f90._4_4_ +
                                 uStack_5eb0._4_4_ * local_6100._20_4_;
                            auVar139._24_4_ =
                                 (float)uStack_5fa8 * (float)uStack_6128 +
                                 afVar39[6] * (float)uStack_5f88 +
                                 (float)uStack_5ea8 * local_6100._24_4_;
                            auVar139._28_4_ = uStack_5f88._4_4_ + uStack_5f88._4_4_ + fVar28;
                            fVar28 = auVar254._20_4_;
                            fVar35 = auVar254._24_4_;
                            auVar182._8_4_ = 0x80000000;
                            auVar182._0_8_ = 0x8000000080000000;
                            auVar182._12_4_ = 0x80000000;
                            auVar182._16_4_ = 0x80000000;
                            auVar182._20_4_ = 0x80000000;
                            auVar182._24_4_ = 0x80000000;
                            auVar182._28_4_ = 0x80000000;
                            auVar140 = vandps_avx(auVar139,auVar182);
                            auVar189 = ZEXT3264(auVar140);
                            uVar97 = auVar140._0_4_;
                            auVar263._0_4_ =
                                 uVar97 ^ (uint)(fVar264 * auVar158._0_4_ +
                                                auVar211._0_4_ * fVar171 + fVar255 * auVar254._0_4_)
                            ;
                            uVar191 = auVar140._4_4_;
                            auVar263._4_4_ =
                                 uVar191 ^ (uint)(fVar265 * auVar158._4_4_ +
                                                 auVar211._4_4_ * fVar190 + fVar257 * auVar254._4_4_
                                                 );
                            uVar193 = auVar140._8_4_;
                            auVar263._8_4_ =
                                 uVar193 ^ (uint)(fVar266 * auVar158._8_4_ +
                                                 auVar211._8_4_ * fVar192 + fVar258 * auVar254._8_4_
                                                 );
                            uVar195 = auVar140._12_4_;
                            auVar263._12_4_ =
                                 uVar195 ^ (uint)(fVar267 * auVar158._12_4_ +
                                                 auVar211._12_4_ * fVar194 +
                                                 fVar259 * auVar254._12_4_);
                            uVar197 = auVar140._16_4_;
                            auVar263._16_4_ =
                                 uVar197 ^ (uint)(fVar268 * auVar158._16_4_ +
                                                 auVar211._16_4_ * fVar196 +
                                                 fVar260 * auVar254._16_4_);
                            uVar199 = auVar140._20_4_;
                            auVar263._20_4_ =
                                 uVar199 ^ (uint)(fVar269 * auVar158._20_4_ +
                                                 auVar211._20_4_ * fVar198 + fVar261 * fVar28);
                            uVar201 = auVar140._24_4_;
                            auVar263._24_4_ =
                                 uVar201 ^ (uint)(fVar270 * auVar158._24_4_ +
                                                 auVar211._24_4_ * fVar200 + fVar262 * fVar35);
                            uVar202 = auVar140._28_4_;
                            auVar263._28_4_ =
                                 uVar202 ^ (uint)(auVar125._28_4_ +
                                                 auVar38._28_4_ + uStack_5f88._4_4_);
                            auVar140 = vcmpps_avx(auVar263,_DAT_01f7b000,5);
                            auVar36 = local_61e0 & auVar140;
                            if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar36 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar36 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar36 >> 0x7f,0) == '\0') &&
                                  (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar36 >> 0xbf,0) == '\0') &&
                                (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar36[0x1f]) {
                              _local_6120 = local_5ee0;
                              local_60c0.v = local_6080.v;
                              local_6100 = local_61c0;
                              _local_6140 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)auVar212;
LAB_0103c975:
                              auVar256 = auVar254._4_12_;
                              auVar230 = local_6140._4_12_;
                              auVar11._8_8_ = uStack_6018;
                              auVar11._0_8_ = local_6020;
                              auVar11._16_8_ = uStack_6010;
                              local_6100 = local_61c0;
                              _local_6120 = local_5ee0;
                              auVar11._24_8_ = uStack_6008;
                              local_60c0.v = local_6080.v;
                              auVar254 = local_6160;
                              _local_6140 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                            local_6000;
                              auVar263 = local_60e0;
                              auVar211 = local_60a0;
LAB_0103c97e:
                              auVar252 = ZEXT3264(auVar211);
                              auVar251 = ZEXT3264(auVar263);
                              auVar245 = ZEXT3264((undefined1  [32])_local_6140);
                              auVar222 = ZEXT3264(auVar254);
                              auVar170 = ZEXT3264(auVar11);
                            }
                            else {
                              local_60c0.i[0] = (int)afVar39[0];
                              local_60c0.i[1] = (int)afVar39[1];
                              local_60c0.i[2] = (int)afVar39[2];
                              local_60c0.i[3] = (int)afVar39[3];
                              local_60c0.i[4] = (int)afVar39[4];
                              local_60c0.i[5] = (int)afVar39[5];
                              local_60c0.i[6] = (int)afVar39[6];
                              local_60c0.i[7] = (int)afVar39[7];
                              auVar140 = vandps_avx(local_61e0,auVar140);
                              fVar171 = auVar37._28_4_;
                              auVar253._0_4_ =
                                   uVar97 ^ (uint)(fVar147 * auVar158._0_4_ +
                                                  auVar211._0_4_ * fVar145 +
                                                  auVar254._0_4_ * fVar146);
                              auVar253._4_4_ =
                                   uVar191 ^ (uint)(fVar114 * auVar158._4_4_ +
                                                   auVar211._4_4_ * fVar148 +
                                                   auVar254._4_4_ * fVar150);
                              auVar253._8_4_ =
                                   uVar193 ^ (uint)(fVar22 * auVar158._8_4_ +
                                                   auVar211._8_4_ * fVar13 + auVar254._8_4_ * fVar16
                                                   );
                              auVar253._12_4_ =
                                   uVar195 ^ (uint)(fVar43 * auVar158._12_4_ +
                                                   auVar211._12_4_ * fVar41 +
                                                   auVar254._12_4_ * fVar42);
                              auVar254._16_4_ =
                                   uVar197 ^ (uint)(fVar19 * auVar158._16_4_ +
                                                   auVar211._16_4_ * fVar17 +
                                                   auVar254._16_4_ * fVar18);
                              auVar254._0_16_ = auVar253;
                              auVar254._20_4_ =
                                   uVar199 ^ (uint)(fVar25 * auVar158._20_4_ +
                                                   auVar211._20_4_ * fVar23 + fVar28 * fVar24);
                              auVar254._24_4_ =
                                   uVar201 ^ (uint)(fVar32 * auVar158._24_4_ +
                                                   auVar211._24_4_ * fVar30 + fVar35 * fVar31);
                              auVar254._28_4_ = uVar202 ^ (uint)(fVar171 + afVar39[7] + fVar171);
                              auVar256 = auVar253._4_12_;
                              auVar158 = vcmpps_avx(auVar254,_DAT_01f7b000,5);
                              auVar211 = auVar140 & auVar158;
                              auVar245 = ZEXT3264(local_6000);
                              auVar251 = ZEXT3264(local_60e0);
                              auVar252 = ZEXT3264(local_60a0);
                              if ((((((((auVar211 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar211 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar211 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar211 >> 0x7f,0) == '\0')
                                    && (auVar211 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar211 >> 0xbf,0) == '\0')
                                  && (auVar211 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar211[0x1f]) {
                                auVar170 = ZEXT3264(CONCAT824(uStack_6008,
                                                              CONCAT816(uStack_6010,
                                                                        CONCAT88(uStack_6018,
                                                                                 local_6020))));
                                auVar222 = ZEXT3264(local_6160);
                                _local_6120 = local_5ee0;
                                local_60c0.v = local_6080.v;
                                local_6100 = local_61c0;
                              }
                              else {
                                auVar244._8_4_ = 0x7fffffff;
                                auVar244._0_8_ = 0x7fffffff7fffffff;
                                auVar244._12_4_ = 0x7fffffff;
                                auVar244._16_4_ = 0x7fffffff;
                                auVar244._20_4_ = 0x7fffffff;
                                auVar244._24_4_ = 0x7fffffff;
                                auVar244._28_4_ = 0x7fffffff;
                                auVar211 = vandps_avx(auVar139,auVar244);
                                auVar140 = vandps_avx(auVar158,auVar140);
                                auVar158 = vsubps_avx(auVar211,auVar263);
                                auVar158 = vcmpps_avx(auVar158,auVar254,5);
                                auVar36 = auVar140 & auVar158;
                                if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar36 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar36 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar36 >> 0x7f,0) != '\0')
                                      || (auVar36 & (undefined1  [32])0x100000000) !=
                                         (undefined1  [32])0x0) || SUB321(auVar36 >> 0xbf,0) != '\0'
                                     ) || (auVar36 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) || auVar36[0x1f] < '\0') {
                                  auVar140 = vandps_avx(auVar158,auVar140);
                                  auVar230 = local_6140._4_12_;
                                  fVar171 = fVar171 + auVar212._28_4_ + auVar158._28_4_;
                                  local_6120._0_4_ =
                                       uVar97 ^ (uint)((float)local_6140 * fVar151 +
                                                      fVar149 * afVar39[0] +
                                                      fVar231 * local_6100._0_4_);
                                  local_6120._4_4_ =
                                       uVar191 ^ (uint)((float)auStack_613c * fVar12 +
                                                       fVar144 * afVar39[1] +
                                                       fVar238 * local_6100._4_4_);
                                  fStack_6118 = (float)(uVar193 ^
                                                       (uint)((float)uStack_6138 * fVar40 +
                                                             fVar29 * afVar39[2] +
                                                             fVar239 * local_6100._8_4_));
                                  fStack_6114 = (float)(uVar195 ^
                                                       (uint)(uStack_6138._4_4_ * fVar15 +
                                                             fVar14 * afVar39[3] +
                                                             fVar240 * local_6100._12_4_));
                                  fStack_6110 = (float)(uVar197 ^
                                                       (uint)((float)uStack_6130 * fVar21 +
                                                             fVar20 * afVar39[4] +
                                                             fVar241 * local_6100._16_4_));
                                  fStack_610c = (float)(uVar199 ^
                                                       (uint)(uStack_6130._4_4_ * fVar27 +
                                                             fVar26 * afVar39[5] +
                                                             fVar242 * local_6100._20_4_));
                                  fStack_6108 = (float)(uVar201 ^
                                                       (uint)((float)uStack_6128 * fVar34 +
                                                             fVar33 * afVar39[6] +
                                                             fVar243 * local_6100._24_4_));
                                  register0x0000131c = uVar202 ^ (uint)fVar171;
                                  auVar80._4_4_ = auVar211._4_4_ * *(float *)(ray + 100);
                                  auVar80._0_4_ = auVar211._0_4_ * *(float *)(ray + 0x60);
                                  auVar80._8_4_ = auVar211._8_4_ * *(float *)(ray + 0x68);
                                  auVar80._12_4_ = auVar211._12_4_ * *(float *)(ray + 0x6c);
                                  auVar80._16_4_ = auVar211._16_4_ * *(float *)(ray + 0x70);
                                  auVar80._20_4_ = auVar211._20_4_ * *(float *)(ray + 0x74);
                                  auVar80._24_4_ = auVar211._24_4_ * *(float *)(ray + 0x78);
                                  auVar80._28_4_ = fVar171;
                                  auVar81._4_4_ = auVar211._4_4_ * *(float *)(ray + 0x104);
                                  auVar81._0_4_ = auVar211._0_4_ * *(float *)(ray + 0x100);
                                  auVar81._8_4_ = auVar211._8_4_ * *(float *)(ray + 0x108);
                                  auVar81._12_4_ = auVar211._12_4_ * *(float *)(ray + 0x10c);
                                  auVar81._16_4_ = auVar211._16_4_ * *(float *)(ray + 0x110);
                                  auVar81._20_4_ = auVar211._20_4_ * *(float *)(ray + 0x114);
                                  auVar81._24_4_ = auVar211._24_4_ * *(float *)(ray + 0x118);
                                  auVar81._28_4_ = uVar202;
                                  auVar158 = vcmpps_avx(auVar80,_local_6120,1);
                                  auVar36 = vcmpps_avx(_local_6120,auVar81,2);
                                  auVar189 = ZEXT3264(auVar36);
                                  auVar158 = vandps_avx(auVar36,auVar158);
                                  auVar36 = auVar140 & auVar158;
                                  if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar36 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar36 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar36 >> 0x7f,0) == '\0') &&
                                        (auVar36 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && SUB321(auVar36 >> 0xbf,0) == '\0')
                                      && (auVar36 & (undefined1  [32])0x100000000) ==
                                         (undefined1  [32])0x0) && -1 < auVar36[0x1f]) {
LAB_0103d72b:
                                    _local_6120 = local_5ee0;
                                    local_60c0.v = local_6080.v;
                                    local_6100 = local_61c0;
                                    goto LAB_0103c975;
                                  }
                                  auVar140 = vandps_avx(auVar158,auVar140);
                                  auVar158 = vcmpps_avx(auVar139,_DAT_01f7b000,4);
                                  auVar36 = auVar140 & auVar158;
                                  if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar36 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar36 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar36 >> 0x7f,0) == '\0') &&
                                        (auVar36 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && SUB321(auVar36 >> 0xbf,0) == '\0')
                                      && (auVar36 & (undefined1  [32])0x100000000) ==
                                         (undefined1  [32])0x0) && -1 < auVar36[0x1f])
                                  goto LAB_0103d72b;
                                  auVar11 = vandps_avx(auVar158,auVar140);
                                  goto LAB_0103c97e;
                                }
                                auVar170 = ZEXT3264(CONCAT824(uStack_6008,
                                                              CONCAT816(uStack_6010,
                                                                        CONCAT88(uStack_6018,
                                                                                 local_6020))));
                                auVar251 = ZEXT3264(local_60e0);
                                auVar222 = ZEXT3264(local_6160);
                                _local_6120 = local_5ee0;
                                auVar245 = ZEXT3264(local_6000);
                                local_60c0.v = local_6080.v;
                                local_6100 = local_61c0;
                              }
                            }
                            auVar272 = ZEXT3264(local_5fe0);
                            auVar271 = ZEXT3264(local_61e0);
                            auVar140 = auVar170._0_32_;
                            if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar140 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar140 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar140 >> 0x7f,0) != '\0') ||
                                  (auVar170 & (undefined1  [64])0x100000000) !=
                                  (undefined1  [64])0x0) || SUB321(auVar140 >> 0xbf,0) != '\0') ||
                                (auVar170 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0)
                                || auVar170[0x1f] < '\0') {
                              local_6160 = auVar252._0_32_;
                              auVar158 = vsubps_avx(local_6160,auVar251._0_32_);
                              auVar211 = vsubps_avx(local_6160,auVar222._0_32_);
                              auVar209._0_4_ = (float)(int)(*(ushort *)(lVar104 + 8 + lVar106) - 1);
                              auVar209._4_12_ = auVar213._4_12_;
                              auVar124 = vrcpss_avx(auVar209,auVar209);
                              auVar225._0_4_ = (float)(int)(*(ushort *)(lVar104 + 10 + lVar106) - 1)
                              ;
                              auVar225._4_12_ = auVar230;
                              auVar219._0_4_ = (float)(int)(((uint)unaff_R14 & 1) + uVar99);
                              auVar219._4_12_ = auVar256;
                              auVar116 = vshufps_avx(auVar219,auVar219,0);
                              fVar145 = auVar252._0_4_;
                              fVar146 = auVar252._4_4_;
                              fVar147 = auVar252._8_4_;
                              fVar149 = auVar252._12_4_;
                              fVar151 = auVar252._16_4_;
                              fVar148 = auVar252._20_4_;
                              fVar150 = auVar252._24_4_;
                              auVar124 = ZEXT416((uint)(auVar124._0_4_ *
                                                       (2.0 - auVar124._0_4_ * auVar209._0_4_)));
                              auVar124 = vshufps_avx(auVar124,auVar124,0);
                              auVar74._4_4_ =
                                   (auVar158._4_4_ + fVar146 * auVar116._4_4_) * auVar124._4_4_;
                              auVar74._0_4_ =
                                   (auVar158._0_4_ + fVar145 * auVar116._0_4_) * auVar124._0_4_;
                              auVar74._8_4_ =
                                   (auVar158._8_4_ + fVar147 * auVar116._8_4_) * auVar124._8_4_;
                              auVar74._12_4_ =
                                   (auVar158._12_4_ + fVar149 * auVar116._12_4_) * auVar124._12_4_;
                              auVar74._16_4_ =
                                   (auVar158._16_4_ + fVar151 * auVar116._0_4_) * auVar124._0_4_;
                              auVar74._20_4_ =
                                   (auVar158._20_4_ + fVar148 * auVar116._4_4_) * auVar124._4_4_;
                              auVar74._24_4_ =
                                   (auVar158._24_4_ + fVar150 * auVar116._8_4_) * auVar124._8_4_;
                              auVar74._28_4_ = auVar124._12_4_;
                              auVar124 = vrcpss_avx(auVar225,auVar225);
                              local_6080 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                           vblendvps_avx(auVar158,auVar74,auVar140);
                              auVar251 = ZEXT3264((undefined1  [32])local_6080);
                              auVar210._0_4_ =
                                   (float)(int)(((uint)(unaff_R14 >> 1) & 0x7fffffff) + uVar98);
                              auVar210._4_12_ = auVar256;
                              auVar116 = vshufps_avx(auVar210,auVar210,0);
                              auVar124 = ZEXT416((uint)(auVar124._0_4_ *
                                                       (2.0 - auVar124._0_4_ * auVar225._0_4_)));
                              auVar124 = vshufps_avx(auVar124,auVar124,0);
                              auVar75._4_4_ =
                                   (auVar211._4_4_ + fVar146 * auVar116._4_4_) * auVar124._4_4_;
                              auVar75._0_4_ =
                                   (auVar211._0_4_ + fVar145 * auVar116._0_4_) * auVar124._0_4_;
                              auVar75._8_4_ =
                                   (auVar211._8_4_ + fVar147 * auVar116._8_4_) * auVar124._8_4_;
                              auVar75._12_4_ =
                                   (auVar211._12_4_ + fVar149 * auVar116._12_4_) * auVar124._12_4_;
                              auVar75._16_4_ =
                                   (auVar211._16_4_ + fVar151 * auVar116._0_4_) * auVar124._0_4_;
                              auVar75._20_4_ =
                                   (auVar211._20_4_ + fVar148 * auVar116._4_4_) * auVar124._4_4_;
                              auVar75._24_4_ =
                                   (auVar211._24_4_ + fVar150 * auVar116._8_4_) * auVar124._8_4_;
                              auVar75._28_4_ = auVar124._12_4_;
                              local_60a0 = vblendvps_avx(auVar211,auVar75,auVar140);
                              auVar222 = ZEXT3264(local_60a0);
                              uVar105 = (ulong)*(uint *)((long)&local_5ef0 + unaff_R14 * 4);
                              pGVar7 = (context->scene->geometries).items[uVar105].ptr;
                              uVar97 = pGVar7->mask;
                              auVar165._4_4_ = uVar97;
                              auVar165._0_4_ = uVar97;
                              auVar165._8_4_ = uVar97;
                              auVar165._12_4_ = uVar97;
                              auVar165._16_4_ = uVar97;
                              auVar165._20_4_ = uVar97;
                              auVar165._24_4_ = uVar97;
                              auVar165._28_4_ = uVar97;
                              auVar158 = vandps_avx(auVar165,*(undefined1 (*) [32])(ray + 0x120));
                              auVar124 = vpcmpeqd_avx(auVar158._16_16_,ZEXT416(0) << 0x20);
                              auVar116 = vpcmpeqd_avx(auVar158._0_16_,ZEXT416(0) << 0x20);
                              auVar183._16_16_ = auVar124;
                              auVar183._0_16_ = auVar170._0_16_;
                              auVar189 = ZEXT3264(auVar183);
                              auVar158 = vblendps_avx(ZEXT1632(auVar116),auVar183,0xf0);
                              auVar211 = auVar140 & ~auVar158;
                              if ((((((((auVar211 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar211 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar211 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar211 >> 0x7f,0) != '\0')
                                    || (auVar211 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar211 >> 0xbf,0) != '\0')
                                  || (auVar211 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar211[0x1f] < '\0') {
                                local_61c0._0_4_ =
                                     *(undefined4 *)((long)&local_5f00 + unaff_R14 * 4);
                                auVar216 = vandnps_avx(auVar158,auVar140);
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  local_5fc0 = CONCAT44(local_5fc0._4_4_,uVar98);
                                  local_5fa0 = CONCAT44(local_5fa0._4_4_,uVar99);
                                  auVar140 = vrcpps_avx(local_6160);
                                  fVar114 = auVar140._0_4_;
                                  fVar144 = auVar140._4_4_;
                                  auVar77._4_4_ = fVar146 * fVar144;
                                  auVar77._0_4_ = fVar145 * fVar114;
                                  fVar145 = auVar140._8_4_;
                                  auVar77._8_4_ = fVar147 * fVar145;
                                  fVar146 = auVar140._12_4_;
                                  auVar77._12_4_ = fVar149 * fVar146;
                                  fVar147 = auVar140._16_4_;
                                  auVar77._16_4_ = fVar151 * fVar147;
                                  fVar149 = auVar140._20_4_;
                                  auVar77._20_4_ = fVar148 * fVar149;
                                  fVar151 = auVar140._24_4_;
                                  auVar77._24_4_ = fVar150 * fVar151;
                                  auVar77._28_4_ = auVar158._28_4_;
                                  auVar185._8_4_ = 0x3f800000;
                                  auVar185._0_8_ = 0x3f8000003f800000;
                                  auVar185._12_4_ = 0x3f800000;
                                  auVar185._16_4_ = 0x3f800000;
                                  auVar185._20_4_ = 0x3f800000;
                                  auVar185._24_4_ = 0x3f800000;
                                  auVar185._28_4_ = 0x3f800000;
                                  auVar158 = vsubps_avx(auVar185,auVar77);
                                  fVar114 = fVar114 + fVar114 * auVar158._0_4_;
                                  fVar144 = fVar144 + fVar144 * auVar158._4_4_;
                                  fVar145 = fVar145 + fVar145 * auVar158._8_4_;
                                  fVar146 = fVar146 + fVar146 * auVar158._12_4_;
                                  fVar147 = fVar147 + fVar147 * auVar158._16_4_;
                                  fVar149 = fVar149 + fVar149 * auVar158._20_4_;
                                  fVar151 = fVar151 + fVar151 * auVar158._24_4_;
                                  _local_6140 = auVar245._0_32_;
                                  local_5e80 = (undefined1  [32])local_60c0;
                                  local_5e60 = local_6100._0_8_;
                                  uStack_5e58 = local_6100._8_8_;
                                  uStack_5e50 = local_6100._16_8_;
                                  uStack_5e48 = local_6100._24_8_;
                                  fStack_5e3c = fVar144 * (float)local_6120._4_4_;
                                  local_5e40 = fVar114 * (float)local_6120._0_4_;
                                  fStack_5e34 = fVar146 * fStack_6114;
                                  fStack_5e38 = fVar145 * fStack_6118;
                                  fStack_5e2c = fVar149 * fStack_610c;
                                  fStack_5e30 = fVar147 * fStack_6110;
                                  fStack_5e24 = auVar158._28_4_;
                                  fStack_5e28 = fVar151 * fStack_6108;
                                  fStack_5e1c = local_60a0._4_4_ * fVar144;
                                  local_5e20 = local_60a0._0_4_ * fVar114;
                                  fStack_5e14 = local_60a0._12_4_ * fVar146;
                                  fStack_5e18 = local_60a0._8_4_ * fVar145;
                                  fStack_5e0c = local_60a0._20_4_ * fVar149;
                                  fStack_5e10 = local_60a0._16_4_ * fVar147;
                                  fStack_5e04 = auVar140._28_4_ + auVar158._28_4_;
                                  fStack_5e08 = local_60a0._24_4_ * fVar151;
                                  fStack_5dfc = local_6080.v[1] * fVar144;
                                  local_5e00 = local_6080.v[0] * fVar114;
                                  fStack_5df8 = local_6080.v[2] * fVar145;
                                  fStack_5df4 = local_6080.v[3] * fVar146;
                                  fStack_5dec = local_6080.v[5] * fVar149;
                                  fStack_5df0 = local_6080.v[4] * fVar147;
                                  fStack_5de8 = local_6080.v[6] * fVar151;
                                  uStack_5de4 = 0x3f800000;
                                  local_61a0 = (undefined1  [8])local_5c80;
                                  uStack_6198 = (vfloat_impl<8> *)&local_5d00;
                                  uStack_6190 = (vfloat_impl<8> *)&local_5ce0;
                                  uStack_6188 = (vfloat_impl<8> *)&local_5f20;
                                  local_60e0._0_8_ = pGVar7;
                                  local_6000 = auVar216;
                                  local_5ec0 = uVar105;
                                  _local_5ea0 = (undefined1  [32])_local_6140;
                                  std::
                                  _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                                  ::
                                  _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                                            ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                              *)local_61a0,
                                             (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                              *)local_5ea0);
                                  pRVar10 = context->user;
                                  local_5dd0 = vshufps_avx(ZEXT416((uint)(float)local_5ec0),
                                                           ZEXT416((uint)(float)local_5ec0),0);
                                  _fStack_5df0 = vshufps_avx(ZEXT416((uint)local_61c0._0_4_),
                                                             ZEXT416((uint)local_61c0._0_4_),0);
                                  local_5ea0._4_4_ = local_5c80[1];
                                  local_5ea0._0_4_ = local_5c80[0];
                                  uStack_5e98._4_4_ = local_5c80[3];
                                  uStack_5e98._0_4_ = local_5c80[2];
                                  uStack_5e90._4_4_ = fStack_5c6c;
                                  uStack_5e90._0_4_ = fStack_5c70;
                                  uStack_5e88._4_4_ = fStack_5c64;
                                  uStack_5e88._0_4_ = fStack_5c68;
                                  auVar124 = local_6000._0_16_;
                                  local_5e60 = local_5c40;
                                  uStack_5e58 = uStack_5c38;
                                  uStack_5e50 = uStack_5c30;
                                  uStack_5e48 = uStack_5c28;
                                  _local_5e40 = CONCAT44(local_5f20.i[1],local_5f20.i[0]);
                                  _fStack_5e38 = CONCAT44(local_5f20.i[3],local_5f20.i[2]);
                                  _fStack_5e30 = CONCAT44(local_5f20.i[5],local_5f20.i[4]);
                                  _fStack_5e28 = CONCAT44(local_5f20.i[7],local_5f20.i[6]);
                                  _local_5e20 = local_5ce0._0_8_;
                                  _fStack_5e18 = local_5ce0._8_8_;
                                  _fStack_5e10 = local_5ce0._16_8_;
                                  _fStack_5e08 = local_5ce0._24_8_;
                                  _local_5e00 = _fStack_5df0;
                                  local_5de0 = local_5dd0;
                                  auVar140 = vcmpps_avx(ZEXT1632(local_5dd0),ZEXT1632(local_5dd0),
                                                        0xf);
                                  local_6030[1] = auVar140;
                                  *local_6030 = auVar140;
                                  local_5dc0 = pRVar10->instID[0];
                                  uStack_5dbc = local_5dc0;
                                  uStack_5db8 = local_5dc0;
                                  uStack_5db4 = local_5dc0;
                                  uStack_5db0 = local_5dc0;
                                  uStack_5dac = local_5dc0;
                                  uStack_5da8 = local_5dc0;
                                  uStack_5da4 = local_5dc0;
                                  local_5da0 = pRVar10->instPrimID[0];
                                  uStack_5d9c = local_5da0;
                                  uStack_5d98 = local_5da0;
                                  uStack_5d94 = local_5da0;
                                  uStack_5d90 = local_5da0;
                                  uStack_5d8c = local_5da0;
                                  uStack_5d88 = local_5da0;
                                  uStack_5d84 = local_5da0;
                                  local_61c0 = *(undefined1 (*) [32])(ray + 0x100);
                                  auVar140 = vblendvps_avx(local_61c0,(undefined1  [32])local_5d00,
                                                           local_6000);
                                  *(undefined1 (*) [32])(ray + 0x100) = auVar140;
                                  _local_6060 = local_6000;
                                  local_61a0 = (undefined1  [8])local_6060;
                                  uStack_6198 = *(vfloat_impl<8> **)(local_60e0._0_8_ + 0x18);
                                  uStack_6190 = (vfloat_impl<8> *)context->user;
                                  uStack_6188 = (vfloat_impl<8> *)ray;
                                  local_6180 = (RTCHitN *)local_5ea0;
                                  local_6178 = 8;
                                  if (*(code **)(local_60e0._0_8_ + 0x48) == (code *)0x0) {
                                    auVar116 = local_6000._16_16_;
                                  }
                                  else {
                                    (**(code **)(local_60e0._0_8_ + 0x48))(local_61a0);
                                    auVar116 = _auStack_6050;
                                    auVar124 = _local_6060;
                                  }
                                  auVar117 = vpcmpeqd_avx(auVar124,(undefined1  [16])0x0);
                                  auVar153 = vpcmpeqd_avx(auVar116,(undefined1  [16])0x0);
                                  auVar167._16_16_ = auVar153;
                                  auVar167._0_16_ = auVar117;
                                  auVar140 = vcmpps_avx(ZEXT1632(auVar153),ZEXT1632(auVar153),0xf);
                                  auVar189 = ZEXT3264(auVar140);
                                  auVar158 = auVar140 & ~auVar167;
                                  auVar272 = ZEXT3264(local_5fe0);
                                  auVar245 = ZEXT3264((undefined1  [32])_local_6140);
                                  auVar252 = ZEXT3264(local_6160);
                                  auVar251 = ZEXT3264((undefined1  [32])local_6080);
                                  auVar222 = ZEXT3264(local_60a0);
                                  uVar98 = (uint)(float)local_5fc0;
                                  uVar99 = (uint)(float)local_5fa0;
                                  if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar158 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar158 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar158 >> 0x7f,0) == '\0') &&
                                        (auVar158 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && SUB321(auVar158 >> 0xbf,0) == '\0'
                                       ) && (auVar158 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) && -1 < auVar158[0x1f]) {
                                    auVar216._0_4_ = auVar117._0_4_ ^ auVar140._0_4_;
                                    auVar216._4_4_ = auVar117._4_4_ ^ auVar140._4_4_;
                                    auVar216._8_4_ = auVar117._8_4_ ^ auVar140._8_4_;
                                    auVar216._12_4_ = auVar117._12_4_ ^ auVar140._12_4_;
                                    auVar216._16_4_ = auVar153._0_4_ ^ auVar140._16_4_;
                                    auVar216._20_4_ = auVar153._4_4_ ^ auVar140._20_4_;
                                    auVar216._24_4_ = auVar153._8_4_ ^ auVar140._24_4_;
                                    auVar216._28_4_ = auVar153._12_4_ ^ auVar140._28_4_;
                                  }
                                  else {
                                    p_Var9 = context->args->filter;
                                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        ((*(byte *)(local_60e0._0_8_ + 0x3e) & 0x40) != 0)))) {
                                      (*p_Var9)((RTCFilterFunctionNArguments *)local_61a0);
                                      auVar222 = ZEXT3264(local_60a0);
                                      auVar251 = ZEXT3264((undefined1  [32])local_6080);
                                      auVar252 = ZEXT3264(local_6160);
                                      auVar245 = ZEXT3264((undefined1  [32])_local_6140);
                                      auVar272 = ZEXT3264(local_5fe0);
                                      uVar98 = (uint)(float)local_5fc0;
                                      auVar116 = _auStack_6050;
                                      auVar124 = _local_6060;
                                      uVar99 = (uint)(float)local_5fa0;
                                    }
                                    auVar117 = ZEXT816(0) << 0x40;
                                    auVar189 = ZEXT1664(auVar117);
                                    auVar124 = vpcmpeqd_avx(auVar124,auVar117);
                                    auVar116 = vpcmpeqd_avx(auVar116,auVar117);
                                    auVar142._16_16_ = auVar116;
                                    auVar142._0_16_ = auVar124;
                                    auVar216._0_8_ = auVar124._0_8_ ^ 0xffffffffffffffff;
                                    auVar216._8_4_ = auVar124._8_4_ ^ 0xffffffff;
                                    auVar216._12_4_ = auVar124._12_4_ ^ 0xffffffff;
                                    auVar216._16_4_ = auVar116._0_4_ ^ 0xffffffff;
                                    auVar216._20_4_ = auVar116._4_4_ ^ 0xffffffff;
                                    auVar216._24_4_ = auVar116._8_4_ ^ 0xffffffff;
                                    auVar216._28_4_ = auVar116._12_4_ ^ 0xffffffff;
                                    auVar168._8_4_ = 0xff800000;
                                    auVar168._0_8_ = 0xff800000ff800000;
                                    auVar168._12_4_ = 0xff800000;
                                    auVar168._16_4_ = 0xff800000;
                                    auVar168._20_4_ = 0xff800000;
                                    auVar168._24_4_ = 0xff800000;
                                    auVar168._28_4_ = 0xff800000;
                                    auVar140 = vblendvps_avx(auVar168,*(undefined1 (*) [32])
                                                                       (uStack_6188 + 8),auVar142);
                                    *(undefined1 (*) [32])(uStack_6188 + 8) = auVar140;
                                  }
                                  auVar140 = vblendvps_avx(local_61c0,
                                                           *(undefined1 (*) [32])local_6038,auVar216
                                                          );
                                  auVar170 = ZEXT3264(auVar140);
                                  *(undefined1 (*) [32])local_6038 = auVar140;
                                  lVar104 = local_61e8;
                                  lVar106 = local_61f0;
                                }
                                auVar140 = vandnps_avx(auVar216,local_61e0);
                                auVar271 = ZEXT3264(auVar140);
                              }
                            }
                            local_6080 = auVar251._0_32_;
                            local_6160 = auVar252._0_32_;
                            _local_6140 = auVar245._0_32_;
                            auVar158 = auVar272._0_32_;
                            unaff_R14 = unaff_R14 + 1;
                            pfVar103 = pfVar103 + 0x10;
                            local_61e0 = auVar271._0_32_;
                          } while ((((((((local_61e0 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0 ||
                                        (local_61e0 >> 0x3f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_61e0 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      SUB321(local_61e0 >> 0x7f,0) != '\0') ||
                                     (auVar271 & (undefined1  [64])0x100000000) !=
                                     (undefined1  [64])0x0) || SUB321(local_61e0 >> 0xbf,0) != '\0')
                                   || (auVar271 & (undefined1  [64])0x100000000) !=
                                      (undefined1  [64])0x0) || auVar271[0x1f] < '\0');
                          auVar140 = auVar158 & local_61e0;
                          bVar113 = (((((((auVar140 >> 0x1f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0 &&
                                         (auVar140 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar140 >> 0x5f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar140 >> 0x7f,0) == '\0'
                                       ) && (auVar140 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                     SUB321(auVar140 >> 0xbf,0) == '\0') &&
                                    (auVar140 & (undefined1  [32])0x100000000) ==
                                    (undefined1  [32])0x0) && -1 < auVar140[0x1f];
                          auVar140 = vandps_avx(local_61e0,auVar158);
                          auVar272 = ZEXT3264(auVar140);
                          uVar101 = local_5f28;
                          lVar100 = local_5f30;
                          uVar105 = local_6028;
                        }
                        local_60a0 = auVar222._0_32_;
                      } while ((!bVar113) && (uVar101 = uVar101 & uVar101 - 1, uVar101 != 0));
                    }
                    lVar100 = local_5f38 + 1;
                  }
                  auVar140 = vcmpps_avx(auVar170._0_32_,auVar170._0_32_,0xf);
                  auVar143._0_4_ = auVar272._0_4_ ^ auVar140._0_4_;
                  auVar143._4_4_ = auVar272._4_4_ ^ auVar140._4_4_;
                  auVar143._8_4_ = auVar272._8_4_ ^ auVar140._8_4_;
                  auVar143._12_4_ = auVar272._12_4_ ^ auVar140._12_4_;
                  auVar143._16_4_ = auVar272._16_4_ ^ auVar140._16_4_;
                  auVar143._20_4_ = auVar272._20_4_ ^ auVar140._20_4_;
                  auVar143._24_4_ = auVar272._24_4_ ^ auVar140._24_4_;
                  auVar143._28_4_ = auVar272._28_4_ ^ auVar140._28_4_;
                  _local_5f80 = vorps_avx(auVar143,_local_5f80);
                  auVar124 = vpcmpeqd_avx(auVar189._0_16_,auVar189._0_16_);
                  auVar116 = vpcmpgtd_avx(local_5f80._16_16_,auVar124);
                  auVar124 = vpcmpgtd_avx(local_5f80._0_16_,auVar124);
                  auVar124 = vpor_avx(auVar124,auVar116);
                  if ((((auVar124 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar124 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar124 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar124[0xf]) goto LAB_0103d925;
                  auVar187._8_4_ = 0xff800000;
                  auVar187._0_8_ = 0xff800000ff800000;
                  auVar187._12_4_ = 0xff800000;
                  auVar187._16_4_ = 0xff800000;
                  auVar187._20_4_ = 0xff800000;
                  auVar187._24_4_ = 0xff800000;
                  auVar187._28_4_ = 0xff800000;
                  auVar189 = ZEXT3264(auVar187);
                  local_5a80 = vblendvps_avx(local_5a80,auVar187,_local_5f80);
                }
                goto LAB_0103bac9;
              }
              auVar159._8_4_ = 0x7f800000;
              auVar159._0_8_ = 0x7f8000007f800000;
              auVar159._12_4_ = 0x7f800000;
              auVar159._16_4_ = 0x7f800000;
              auVar159._20_4_ = 0x7f800000;
              auVar159._24_4_ = 0x7f800000;
              auVar159._28_4_ = 0x7f800000;
              for (lVar100 = 0;
                  (auVar170 = ZEXT3264(auVar159), lVar100 != 8 &&
                  (uVar101 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar100 * 8), uVar101 != 8
                  )); lVar100 = lVar100 + 1) {
                uVar110 = *(undefined4 *)(root.ptr + 0x40 + lVar100 * 4);
                auVar126._4_4_ = uVar110;
                auVar126._0_4_ = uVar110;
                auVar126._8_4_ = uVar110;
                auVar126._12_4_ = uVar110;
                auVar126._16_4_ = uVar110;
                auVar126._20_4_ = uVar110;
                auVar126._24_4_ = uVar110;
                auVar126._28_4_ = uVar110;
                auVar82._8_8_ = local_5c20._8_8_;
                auVar82._0_8_ = local_5c20._0_8_;
                auVar82._16_8_ = local_5c20._16_8_;
                auVar82._24_8_ = local_5c20._24_8_;
                auVar84._8_8_ = local_5c20._40_8_;
                auVar84._0_8_ = local_5c20._32_8_;
                auVar84._16_8_ = local_5c20._48_8_;
                auVar84._24_8_ = local_5c20._56_8_;
                auVar86._8_8_ = local_5c20._72_8_;
                auVar86._0_8_ = local_5c20._64_8_;
                auVar86._16_8_ = local_5c20._80_8_;
                auVar86._24_8_ = local_5c20._88_8_;
                auVar140 = vsubps_avx(auVar126,auVar82);
                auVar115._0_4_ = (float)local_5b60._0_4_ * auVar140._0_4_;
                auVar115._4_4_ = (float)local_5b60._4_4_ * auVar140._4_4_;
                auVar115._8_4_ = fStack_5b58 * auVar140._8_4_;
                auVar115._12_4_ = fStack_5b54 * auVar140._12_4_;
                auVar44._16_4_ = fStack_5b50 * auVar140._16_4_;
                auVar44._0_16_ = auVar115;
                auVar44._20_4_ = fStack_5b4c * auVar140._20_4_;
                auVar44._24_4_ = fStack_5b48 * auVar140._24_4_;
                auVar44._28_4_ = auVar140._28_4_;
                uVar110 = *(undefined4 *)(root.ptr + 0x80 + lVar100 * 4);
                auVar160._4_4_ = uVar110;
                auVar160._0_4_ = uVar110;
                auVar160._8_4_ = uVar110;
                auVar160._12_4_ = uVar110;
                auVar160._16_4_ = uVar110;
                auVar160._20_4_ = uVar110;
                auVar160._24_4_ = uVar110;
                auVar160._28_4_ = uVar110;
                auVar140 = vsubps_avx(auVar160,auVar84);
                auVar152._0_4_ = (float)local_5b40._0_4_ * auVar140._0_4_;
                auVar152._4_4_ = (float)local_5b40._4_4_ * auVar140._4_4_;
                auVar152._8_4_ = fStack_5b38 * auVar140._8_4_;
                auVar152._12_4_ = fStack_5b34 * auVar140._12_4_;
                auVar45._16_4_ = fStack_5b30 * auVar140._16_4_;
                auVar45._0_16_ = auVar152;
                auVar45._20_4_ = fStack_5b2c * auVar140._20_4_;
                auVar45._24_4_ = fStack_5b28 * auVar140._24_4_;
                auVar45._28_4_ = auVar140._28_4_;
                uVar110 = *(undefined4 *)(root.ptr + 0xc0 + lVar100 * 4);
                auVar175._4_4_ = uVar110;
                auVar175._0_4_ = uVar110;
                auVar175._8_4_ = uVar110;
                auVar175._12_4_ = uVar110;
                auVar175._16_4_ = uVar110;
                auVar175._20_4_ = uVar110;
                auVar175._24_4_ = uVar110;
                auVar175._28_4_ = uVar110;
                auVar140 = vsubps_avx(auVar175,auVar86);
                auVar173._0_4_ = (float)local_5b20._0_4_ * auVar140._0_4_;
                auVar173._4_4_ = (float)local_5b20._4_4_ * auVar140._4_4_;
                auVar173._8_4_ = fStack_5b18 * auVar140._8_4_;
                auVar173._12_4_ = fStack_5b14 * auVar140._12_4_;
                auVar46._16_4_ = fStack_5b10 * auVar140._16_4_;
                auVar46._0_16_ = auVar173;
                auVar46._20_4_ = fStack_5b0c * auVar140._20_4_;
                auVar46._24_4_ = fStack_5b08 * auVar140._24_4_;
                auVar46._28_4_ = auVar140._28_4_;
                uVar110 = *(undefined4 *)(root.ptr + 0x60 + lVar100 * 4);
                auVar248._4_4_ = uVar110;
                auVar248._0_4_ = uVar110;
                auVar248._8_4_ = uVar110;
                auVar248._12_4_ = uVar110;
                auVar248._16_4_ = uVar110;
                auVar248._20_4_ = uVar110;
                auVar248._24_4_ = uVar110;
                auVar248._28_4_ = uVar110;
                auVar140 = vsubps_avx(auVar248,auVar82);
                auVar203._0_4_ = (float)local_5b60._0_4_ * auVar140._0_4_;
                auVar203._4_4_ = (float)local_5b60._4_4_ * auVar140._4_4_;
                auVar203._8_4_ = fStack_5b58 * auVar140._8_4_;
                auVar203._12_4_ = fStack_5b54 * auVar140._12_4_;
                auVar47._16_4_ = fStack_5b50 * auVar140._16_4_;
                auVar47._0_16_ = auVar203;
                auVar47._20_4_ = fStack_5b4c * auVar140._20_4_;
                auVar47._24_4_ = fStack_5b48 * auVar140._24_4_;
                auVar47._28_4_ = auVar140._28_4_;
                uVar110 = *(undefined4 *)(root.ptr + 0xa0 + lVar100 * 4);
                auVar233._4_4_ = uVar110;
                auVar233._0_4_ = uVar110;
                auVar233._8_4_ = uVar110;
                auVar233._12_4_ = uVar110;
                auVar233._16_4_ = uVar110;
                auVar233._20_4_ = uVar110;
                auVar233._24_4_ = uVar110;
                auVar233._28_4_ = uVar110;
                auVar140 = vsubps_avx(auVar233,auVar84);
                auVar217._0_4_ = (float)local_5b40._0_4_ * auVar140._0_4_;
                auVar217._4_4_ = (float)local_5b40._4_4_ * auVar140._4_4_;
                auVar217._8_4_ = fStack_5b38 * auVar140._8_4_;
                auVar217._12_4_ = fStack_5b34 * auVar140._12_4_;
                auVar48._16_4_ = fStack_5b30 * auVar140._16_4_;
                auVar48._0_16_ = auVar217;
                auVar48._20_4_ = fStack_5b2c * auVar140._20_4_;
                auVar48._24_4_ = fStack_5b28 * auVar140._24_4_;
                auVar48._28_4_ = auVar140._28_4_;
                auVar222 = ZEXT3264(auVar48);
                uVar110 = *(undefined4 *)(root.ptr + 0xe0 + lVar100 * 4);
                auVar234._4_4_ = uVar110;
                auVar234._0_4_ = uVar110;
                auVar234._8_4_ = uVar110;
                auVar234._12_4_ = uVar110;
                auVar234._16_4_ = uVar110;
                auVar234._20_4_ = uVar110;
                auVar234._24_4_ = uVar110;
                auVar234._28_4_ = uVar110;
                auVar140 = vsubps_avx(auVar234,auVar86);
                auVar223._0_4_ = (float)local_5b20._0_4_ * auVar140._0_4_;
                auVar223._4_4_ = (float)local_5b20._4_4_ * auVar140._4_4_;
                auVar223._8_4_ = fStack_5b18 * auVar140._8_4_;
                auVar223._12_4_ = fStack_5b14 * auVar140._12_4_;
                auVar49._16_4_ = fStack_5b10 * auVar140._16_4_;
                auVar49._0_16_ = auVar223;
                auVar49._20_4_ = fStack_5b0c * auVar140._20_4_;
                auVar49._24_4_ = fStack_5b08 * auVar140._24_4_;
                auVar49._28_4_ = auVar140._28_4_;
                auVar124 = vpminsd_avx(auVar44._16_16_,auVar47._16_16_);
                auVar116 = vpminsd_avx(auVar115,auVar203);
                auVar117 = vpminsd_avx(auVar45._16_16_,auVar48._16_16_);
                auVar124 = vpmaxsd_avx(auVar124,auVar117);
                auVar117 = vpminsd_avx(auVar152,auVar217);
                auVar116 = vpmaxsd_avx(auVar116,auVar117);
                auVar117 = vpminsd_avx(auVar173,auVar223);
                auVar116 = vpmaxsd_avx(auVar116,auVar117);
                auVar117 = vpminsd_avx(auVar46._16_16_,auVar49._16_16_);
                auVar124 = vpmaxsd_avx(auVar124,auVar117);
                auVar117 = vpmaxsd_avx(auVar116,local_5aa0._0_16_);
                auVar153 = vpmaxsd_avx(auVar124,local_5aa0._16_16_);
                auVar204 = vpmaxsd_avx(auVar44._16_16_,auVar47._16_16_);
                auVar115 = vpmaxsd_avx(auVar115,auVar203);
                auVar203 = vpmaxsd_avx(auVar45._16_16_,auVar48._16_16_);
                auVar203 = vpminsd_avx(auVar204,auVar203);
                auVar204 = vpmaxsd_avx(auVar152,auVar217);
                auVar115 = vpminsd_avx(auVar115,auVar204);
                auVar204 = vpmaxsd_avx(auVar173,auVar223);
                auVar115 = vpminsd_avx(auVar115,auVar204);
                auVar204 = vpmaxsd_avx(auVar46._16_16_,auVar49._16_16_);
                auVar204 = vpminsd_avx(auVar203,auVar204);
                auVar115 = vpminsd_avx(auVar115,local_5a80._0_16_);
                auVar204 = vpminsd_avx(auVar204,local_5a80._16_16_);
                auVar176._16_16_ = auVar153;
                auVar176._0_16_ = auVar117;
                auVar189 = ZEXT3264(auVar176);
                auVar127._16_16_ = auVar204;
                auVar127._0_16_ = auVar115;
                auVar158 = vcmpps_avx(auVar176,auVar127,2);
                uVar111 = uVar108;
                auVar140 = auVar159;
                if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar158 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar158 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar158 >> 0x7f,0) != '\0') ||
                      (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar158 >> 0xbf,0) != '\0') ||
                    (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar158[0x1f] < '\0') {
                  auVar161._16_16_ = auVar124;
                  auVar161._0_16_ = auVar116;
                  auVar140 = vblendps_avx(auVar161,auVar161,0xf0);
                  auVar177._8_4_ = 0x7f800000;
                  auVar177._0_8_ = 0x7f8000007f800000;
                  auVar177._12_4_ = 0x7f800000;
                  auVar177._16_4_ = 0x7f800000;
                  auVar177._20_4_ = 0x7f800000;
                  auVar177._24_4_ = 0x7f800000;
                  auVar177._28_4_ = 0x7f800000;
                  auVar189 = ZEXT3264(auVar177);
                  auVar140 = vblendvps_avx(auVar177,auVar140,auVar158);
                  uVar111 = uVar101;
                  if (uVar108 != 8) {
                    *puVar112 = uVar108;
                    puVar112 = puVar112 + 1;
                    local_61e0._0_8_ = auVar159._0_8_;
                    local_61e0._8_8_ = auVar159._8_8_;
                    local_61e0._16_8_ = auVar159._16_8_;
                    local_61e0._24_8_ = auVar159._24_8_;
                    *(undefined8 *)*pauVar109 = local_61e0._0_8_;
                    *(undefined8 *)(*pauVar109 + 8) = local_61e0._8_8_;
                    *(undefined8 *)(*pauVar109 + 0x10) = local_61e0._16_8_;
                    *(undefined8 *)(*pauVar109 + 0x18) = local_61e0._24_8_;
                    pauVar109 = pauVar109 + 1;
                  }
                }
                auVar159 = auVar140;
                uVar108 = uVar111;
              }
              if (uVar108 == 8) goto LAB_0103bd34;
              auVar140 = vcmpps_avx(local_5a80,auVar159,6);
              uVar110 = vmovmskps_avx(auVar140);
              root.ptr = uVar108;
            } while ((byte)uVar105 < (byte)POPCOUNT(uVar110));
            *puVar112 = uVar108;
            puVar112 = puVar112 + 1;
            *pauVar109 = auVar159;
            pauVar109 = pauVar109 + 1;
LAB_0103bd34:
            iVar96 = 4;
          }
          else {
            while (auVar124 = auVar189._0_16_, unaff_R14 != 0) {
              k = 0;
              if (unaff_R14 != 0) {
                for (; (unaff_R14 >> k & 1) == 0; k = k + 1) {
                }
              }
              unaff_R14 = unaff_R14 & unaff_R14 - 1;
              local_61c0._0_8_ = k;
              auVar189 = ZEXT1664(auVar124);
              auVar222 = ZEXT1664(auVar222._0_16_);
              bVar113 = occluded1(local_5f48,local_5f50,root,k,&local_61f1,ray,
                                  (TravRayK<8,_false> *)&local_5c20.field_0,context);
              uVar105 = local_6028;
              if (bVar113) {
                *(undefined4 *)(local_5f80 + local_61c0._0_8_ * 4) = 0xffffffff;
              }
            }
            auVar124 = vpcmpeqd_avx(auVar124,auVar124);
            auVar116 = vpcmpgtd_avx(stack0xffffffffffffa090,auVar124);
            auVar124 = vpcmpgtd_avx(local_5f80._0_16_,auVar124);
            auVar189 = ZEXT1664(auVar124);
            auVar124 = vpor_avx(auVar124,auVar116);
            iVar96 = 3;
            if ((((auVar124 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar124 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar124 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar124[0xf] < '\0') {
              auVar188._8_4_ = 0xff800000;
              auVar188._0_8_ = 0xff800000ff800000;
              auVar188._12_4_ = 0xff800000;
              auVar188._16_4_ = 0xff800000;
              auVar188._20_4_ = 0xff800000;
              auVar188._24_4_ = 0xff800000;
              auVar188._28_4_ = 0xff800000;
              auVar189 = ZEXT3264(auVar188);
              local_5a80 = vblendvps_avx(local_5a80,auVar188,_local_5f80);
              iVar96 = 2;
            }
            auVar170 = ZEXT3264(local_61e0);
            unaff_R14 = 0;
            if ((uint)uVar105 < (uint)POPCOUNT(uVar110)) goto LAB_0103bb08;
          }
        } while ((iVar96 == 4) || (iVar96 == 2));
LAB_0103d925:
        auVar140 = vandps_avx(local_5960,_local_5f80);
        auVar169._8_4_ = 0xff800000;
        auVar169._0_8_ = 0xff800000ff800000;
        auVar169._12_4_ = 0xff800000;
        auVar169._16_4_ = 0xff800000;
        auVar169._20_4_ = 0xff800000;
        auVar169._24_4_ = 0xff800000;
        auVar169._28_4_ = 0xff800000;
        auVar140 = vmaskmovps_avx(auVar140,auVar169);
        *(undefined1 (*) [32])local_6038 = auVar140;
        return;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }